

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<8,16>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  undefined8 uVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  byte bVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar26;
  uint uVar27;
  long lVar28;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  bool bVar32;
  bool bVar33;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar46 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 in_ZmmResult [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar85 [64];
  undefined1 auVar87 [64];
  undefined1 auVar50 [16];
  undefined1 auVar89 [64];
  undefined1 auVar91 [64];
  undefined1 auVar93 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  int iVar97;
  float t1;
  float fVar98;
  undefined1 auVar99 [16];
  float fVar101;
  float fVar102;
  undefined1 auVar100 [64];
  undefined4 uVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar114 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar142;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  vfloat4 b0;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  vfloat4 b0_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar174;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar161 [16];
  undefined1 auVar173 [32];
  vfloat4 a0_3;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  vfloat4 a0_2;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar193;
  float fVar204;
  float fVar205;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar206;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar221;
  float fVar228;
  float fVar229;
  vfloat4 a0_1;
  float fVar230;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  vfloat4 a0;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  int iVar250;
  undefined1 in_ZMM30 [64];
  undefined1 auVar251 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar252 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  bool local_761;
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  uint auStack_5e0 [4];
  RTCFilterFunctionNArguments local_5d0;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [16];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  uint uStack_460;
  float afStack_45c [7];
  undefined1 local_440 [64];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar25;
  undefined1 auVar84 [64];
  undefined1 auVar86 [64];
  undefined1 auVar88 [64];
  undefined1 auVar90 [64];
  undefined1 auVar92 [64];
  undefined1 auVar94 [64];
  
  PVar4 = prim[1];
  uVar24 = (ulong)(byte)PVar4;
  fVar209 = *(float *)(prim + uVar24 * 0x19 + 0x12);
  auVar34 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar45 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar36 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar47 = vsubps_avx(auVar34,*(undefined1 (*) [16])(prim + uVar24 * 0x19 + 6));
  fVar125 = fVar209 * auVar47._0_4_;
  fVar98 = fVar209 * auVar36._0_4_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar24 * 4 + 6);
  auVar65 = vpmovsxbd_avx2(auVar34);
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar24 * 5 + 6);
  auVar63 = vpmovsxbd_avx2(auVar45);
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar24 * 6 + 6);
  auVar64 = vpmovsxbd_avx2(auVar44);
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar24 * 0xb + 6);
  auVar74 = vpmovsxbd_avx2(auVar43);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar75 = vpmovsxbd_avx2(auVar42);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar24 + 6);
  auVar76 = vpmovsxbd_avx2(auVar41);
  auVar76 = vcvtdq2ps_avx(auVar76);
  uVar31 = (ulong)(uint)((int)(uVar24 * 9) * 2);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar31 + 6);
  auVar66 = vpmovsxbd_avx2(auVar40);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar31 + uVar24 + 6);
  auVar69 = vpmovsxbd_avx2(auVar39);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar67 = vcvtdq2ps_avx(auVar69);
  uVar29 = (ulong)(uint)((int)(uVar24 * 5) << 2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar29 + 6);
  auVar61 = vpmovsxbd_avx2(auVar3);
  auVar68 = vcvtdq2ps_avx(auVar61);
  auVar133._4_4_ = fVar98;
  auVar133._0_4_ = fVar98;
  auVar133._8_4_ = fVar98;
  auVar133._12_4_ = fVar98;
  auVar133._16_4_ = fVar98;
  auVar133._20_4_ = fVar98;
  auVar133._24_4_ = fVar98;
  auVar133._28_4_ = fVar98;
  auVar242._8_4_ = 1;
  auVar242._0_8_ = 0x100000001;
  auVar242._12_4_ = 1;
  auVar242._16_4_ = 1;
  auVar242._20_4_ = 1;
  auVar242._24_4_ = 1;
  auVar242._28_4_ = 1;
  auVar70 = ZEXT1632(CONCAT412(fVar209 * auVar36._12_4_,
                               CONCAT48(fVar209 * auVar36._8_4_,
                                        CONCAT44(fVar209 * auVar36._4_4_,fVar98))));
  auVar62 = vpermps_avx2(auVar242,auVar70);
  auVar244._32_32_ = in_ZmmResult._32_32_;
  auVar59 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar60 = vpermps_avx512vl(auVar59,auVar70);
  fVar98 = auVar60._0_4_;
  fVar208 = auVar60._4_4_;
  auVar70._4_4_ = fVar208 * auVar64._4_4_;
  auVar70._0_4_ = fVar98 * auVar64._0_4_;
  fVar193 = auVar60._8_4_;
  auVar70._8_4_ = fVar193 * auVar64._8_4_;
  fVar204 = auVar60._12_4_;
  auVar70._12_4_ = fVar204 * auVar64._12_4_;
  fVar205 = auVar60._16_4_;
  auVar70._16_4_ = fVar205 * auVar64._16_4_;
  fVar101 = auVar60._20_4_;
  auVar70._20_4_ = fVar101 * auVar64._20_4_;
  fVar102 = auVar60._24_4_;
  auVar70._24_4_ = fVar102 * auVar64._24_4_;
  auVar70._28_4_ = auVar69._28_4_;
  auVar69._4_4_ = auVar76._4_4_ * fVar208;
  auVar69._0_4_ = auVar76._0_4_ * fVar98;
  auVar69._8_4_ = auVar76._8_4_ * fVar193;
  auVar69._12_4_ = auVar76._12_4_ * fVar204;
  auVar69._16_4_ = auVar76._16_4_ * fVar205;
  auVar69._20_4_ = auVar76._20_4_ * fVar101;
  auVar69._24_4_ = auVar76._24_4_ * fVar102;
  auVar69._28_4_ = auVar61._28_4_;
  auVar61._4_4_ = auVar68._4_4_ * fVar208;
  auVar61._0_4_ = auVar68._0_4_ * fVar98;
  auVar61._8_4_ = auVar68._8_4_ * fVar193;
  auVar61._12_4_ = auVar68._12_4_ * fVar204;
  auVar61._16_4_ = auVar68._16_4_ * fVar205;
  auVar61._20_4_ = auVar68._20_4_ * fVar101;
  auVar61._24_4_ = auVar68._24_4_ * fVar102;
  auVar61._28_4_ = auVar60._28_4_;
  auVar34 = vfmadd231ps_fma(auVar70,auVar62,auVar63);
  auVar45 = vfmadd231ps_fma(auVar69,auVar62,auVar75);
  auVar44 = vfmadd231ps_fma(auVar61,auVar67,auVar62);
  auVar34 = vfmadd231ps_fma(ZEXT1632(auVar34),auVar133,auVar65);
  auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar133,auVar74);
  auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar66,auVar133);
  auVar140._4_4_ = fVar125;
  auVar140._0_4_ = fVar125;
  auVar140._8_4_ = fVar125;
  auVar140._12_4_ = fVar125;
  auVar140._16_4_ = fVar125;
  auVar140._20_4_ = fVar125;
  auVar140._24_4_ = fVar125;
  auVar140._28_4_ = fVar125;
  auVar61 = ZEXT1632(CONCAT412(fVar209 * auVar47._12_4_,
                               CONCAT48(fVar209 * auVar47._8_4_,
                                        CONCAT44(fVar209 * auVar47._4_4_,fVar125))));
  auVar69 = vpermps_avx2(auVar242,auVar61);
  auVar61 = vpermps_avx512vl(auVar59,auVar61);
  auVar62 = vmulps_avx512vl(auVar61,auVar64);
  auVar72._0_4_ = auVar61._0_4_ * auVar76._0_4_;
  auVar72._4_4_ = auVar61._4_4_ * auVar76._4_4_;
  auVar72._8_4_ = auVar61._8_4_ * auVar76._8_4_;
  auVar72._12_4_ = auVar61._12_4_ * auVar76._12_4_;
  auVar72._16_4_ = auVar61._16_4_ * auVar76._16_4_;
  auVar72._20_4_ = auVar61._20_4_ * auVar76._20_4_;
  auVar72._24_4_ = auVar61._24_4_ * auVar76._24_4_;
  auVar72._28_4_ = 0;
  auVar76._4_4_ = auVar61._4_4_ * auVar68._4_4_;
  auVar76._0_4_ = auVar61._0_4_ * auVar68._0_4_;
  auVar76._8_4_ = auVar61._8_4_ * auVar68._8_4_;
  auVar76._12_4_ = auVar61._12_4_ * auVar68._12_4_;
  auVar76._16_4_ = auVar61._16_4_ * auVar68._16_4_;
  auVar76._20_4_ = auVar61._20_4_ * auVar68._20_4_;
  auVar76._24_4_ = auVar61._24_4_ * auVar68._24_4_;
  auVar76._28_4_ = auVar64._28_4_;
  auVar63 = vfmadd231ps_avx512vl(auVar62,auVar69,auVar63);
  auVar43 = vfmadd231ps_fma(auVar72,auVar69,auVar75);
  auVar42 = vfmadd231ps_fma(auVar76,auVar69,auVar67);
  auVar63 = vfmadd231ps_avx512vl(auVar63,auVar140,auVar65);
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar140,auVar74);
  auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar140,auVar66);
  auVar77._8_4_ = 0x7fffffff;
  auVar77._0_8_ = 0x7fffffff7fffffff;
  auVar77._12_4_ = 0x7fffffff;
  auVar77._16_4_ = 0x7fffffff;
  auVar77._20_4_ = 0x7fffffff;
  auVar77._24_4_ = 0x7fffffff;
  auVar77._28_4_ = 0x7fffffff;
  auVar65 = vandps_avx(ZEXT1632(auVar34),auVar77);
  auVar79._8_4_ = 0x219392ef;
  auVar79._0_8_ = 0x219392ef219392ef;
  auVar79._12_4_ = 0x219392ef;
  auVar79._16_4_ = 0x219392ef;
  auVar79._20_4_ = 0x219392ef;
  auVar79._24_4_ = 0x219392ef;
  auVar79._28_4_ = 0x219392ef;
  uVar31 = vcmpps_avx512vl(auVar65,auVar79,1);
  bVar32 = (bool)((byte)uVar31 & 1);
  auVar62._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar34._0_4_;
  bVar32 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar62._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar34._4_4_;
  bVar32 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar62._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar34._8_4_;
  bVar32 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar62._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar34._12_4_;
  auVar62._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * 0x219392ef;
  auVar62._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * 0x219392ef;
  auVar62._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * 0x219392ef;
  auVar62._28_4_ = (uint)(byte)(uVar31 >> 7) * 0x219392ef;
  auVar65 = vandps_avx(ZEXT1632(auVar45),auVar77);
  uVar31 = vcmpps_avx512vl(auVar65,auVar79,1);
  bVar32 = (bool)((byte)uVar31 & 1);
  auVar59._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar45._0_4_;
  bVar32 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar59._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar45._4_4_;
  bVar32 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar59._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar45._8_4_;
  bVar32 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar59._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar45._12_4_;
  auVar59._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * 0x219392ef;
  auVar59._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * 0x219392ef;
  auVar59._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * 0x219392ef;
  auVar59._28_4_ = (uint)(byte)(uVar31 >> 7) * 0x219392ef;
  auVar65 = vandps_avx(ZEXT1632(auVar44),auVar77);
  uVar31 = vcmpps_avx512vl(auVar65,auVar79,1);
  bVar32 = (bool)((byte)uVar31 & 1);
  auVar65._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar44._0_4_;
  bVar32 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar65._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar44._4_4_;
  bVar32 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar65._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar44._8_4_;
  bVar32 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar65._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar44._12_4_;
  auVar65._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * 0x219392ef;
  auVar65._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * 0x219392ef;
  auVar65._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * 0x219392ef;
  auVar65._28_4_ = (uint)(byte)(uVar31 >> 7) * 0x219392ef;
  auVar64 = vrcp14ps_avx512vl(auVar62);
  auVar78._8_4_ = 0x3f800000;
  auVar78._0_8_ = &DAT_3f8000003f800000;
  auVar78._12_4_ = 0x3f800000;
  auVar78._16_4_ = 0x3f800000;
  auVar78._20_4_ = 0x3f800000;
  auVar78._24_4_ = 0x3f800000;
  auVar78._28_4_ = 0x3f800000;
  auVar34 = vfnmadd213ps_fma(auVar62,auVar64,auVar78);
  auVar34 = vfmadd132ps_fma(ZEXT1632(auVar34),auVar64,auVar64);
  auVar64 = vrcp14ps_avx512vl(auVar59);
  auVar45 = vfnmadd213ps_fma(auVar59,auVar64,auVar78);
  auVar45 = vfmadd132ps_fma(ZEXT1632(auVar45),auVar64,auVar64);
  auVar64 = vrcp14ps_avx512vl(auVar65);
  auVar44 = vfnmadd213ps_fma(auVar65,auVar64,auVar78);
  auVar44 = vfmadd132ps_fma(ZEXT1632(auVar44),auVar64,auVar64);
  auVar65 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar24 * 7 + 6));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar64 = vsubps_avx512vl(auVar65,auVar63);
  auVar65 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar24 * 9 + 6));
  auVar66._4_4_ = auVar34._4_4_ * auVar64._4_4_;
  auVar66._0_4_ = auVar34._0_4_ * auVar64._0_4_;
  auVar66._8_4_ = auVar34._8_4_ * auVar64._8_4_;
  auVar66._12_4_ = auVar34._12_4_ * auVar64._12_4_;
  auVar66._16_4_ = auVar64._16_4_ * 0.0;
  auVar66._20_4_ = auVar64._20_4_ * 0.0;
  auVar66._24_4_ = auVar64._24_4_ * 0.0;
  auVar66._28_4_ = auVar64._28_4_;
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar65 = vsubps_avx512vl(auVar65,auVar63);
  auVar73._0_4_ = auVar34._0_4_ * auVar65._0_4_;
  auVar73._4_4_ = auVar34._4_4_ * auVar65._4_4_;
  auVar73._8_4_ = auVar34._8_4_ * auVar65._8_4_;
  auVar73._12_4_ = auVar34._12_4_ * auVar65._12_4_;
  auVar73._16_4_ = auVar65._16_4_ * 0.0;
  auVar73._20_4_ = auVar65._20_4_ * 0.0;
  auVar73._24_4_ = auVar65._24_4_ * 0.0;
  auVar73._28_4_ = 0;
  auVar63 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar65 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar24 * -2 + 6));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar65 = vsubps_avx(auVar65,ZEXT1632(auVar43));
  auVar67._4_4_ = auVar45._4_4_ * auVar65._4_4_;
  auVar67._0_4_ = auVar45._0_4_ * auVar65._0_4_;
  auVar67._8_4_ = auVar45._8_4_ * auVar65._8_4_;
  auVar67._12_4_ = auVar45._12_4_ * auVar65._12_4_;
  auVar67._16_4_ = auVar65._16_4_ * 0.0;
  auVar67._20_4_ = auVar65._20_4_ * 0.0;
  auVar67._24_4_ = auVar65._24_4_ * 0.0;
  auVar67._28_4_ = auVar65._28_4_;
  auVar65 = vcvtdq2ps_avx(auVar63);
  auVar65 = vsubps_avx(auVar65,ZEXT1632(auVar43));
  auVar71._0_4_ = auVar45._0_4_ * auVar65._0_4_;
  auVar71._4_4_ = auVar45._4_4_ * auVar65._4_4_;
  auVar71._8_4_ = auVar45._8_4_ * auVar65._8_4_;
  auVar71._12_4_ = auVar45._12_4_ * auVar65._12_4_;
  auVar71._16_4_ = auVar65._16_4_ * 0.0;
  auVar71._20_4_ = auVar65._20_4_ * 0.0;
  auVar71._24_4_ = auVar65._24_4_ * 0.0;
  auVar71._28_4_ = 0;
  auVar65 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 + uVar24 + 6));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar65 = vsubps_avx(auVar65,ZEXT1632(auVar42));
  auVar68._4_4_ = auVar65._4_4_ * auVar44._4_4_;
  auVar68._0_4_ = auVar65._0_4_ * auVar44._0_4_;
  auVar68._8_4_ = auVar65._8_4_ * auVar44._8_4_;
  auVar68._12_4_ = auVar65._12_4_ * auVar44._12_4_;
  auVar68._16_4_ = auVar65._16_4_ * 0.0;
  auVar68._20_4_ = auVar65._20_4_ * 0.0;
  auVar68._24_4_ = auVar65._24_4_ * 0.0;
  auVar68._28_4_ = auVar65._28_4_;
  auVar65 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar24 * 0x17 + 6));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar65 = vsubps_avx(auVar65,ZEXT1632(auVar42));
  auVar60._0_4_ = auVar44._0_4_ * auVar65._0_4_;
  auVar60._4_4_ = auVar44._4_4_ * auVar65._4_4_;
  auVar60._8_4_ = auVar44._8_4_ * auVar65._8_4_;
  auVar60._12_4_ = auVar44._12_4_ * auVar65._12_4_;
  auVar60._16_4_ = auVar65._16_4_ * 0.0;
  auVar60._20_4_ = auVar65._20_4_ * 0.0;
  auVar60._24_4_ = auVar65._24_4_ * 0.0;
  auVar60._28_4_ = 0;
  auVar65 = vpminsd_avx2(auVar66,auVar73);
  auVar63 = vpminsd_avx2(auVar67,auVar71);
  auVar65 = vmaxps_avx(auVar65,auVar63);
  auVar63 = vpminsd_avx2(auVar68,auVar60);
  uVar103 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar64._4_4_ = uVar103;
  auVar64._0_4_ = uVar103;
  auVar64._8_4_ = uVar103;
  auVar64._12_4_ = uVar103;
  auVar64._16_4_ = uVar103;
  auVar64._20_4_ = uVar103;
  auVar64._24_4_ = uVar103;
  auVar64._28_4_ = uVar103;
  auVar63 = vmaxps_avx512vl(auVar63,auVar64);
  auVar65 = vmaxps_avx(auVar65,auVar63);
  auVar63._8_4_ = 0x3f7ffffa;
  auVar63._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar63._12_4_ = 0x3f7ffffa;
  auVar63._16_4_ = 0x3f7ffffa;
  auVar63._20_4_ = 0x3f7ffffa;
  auVar63._24_4_ = 0x3f7ffffa;
  auVar63._28_4_ = 0x3f7ffffa;
  local_400 = vmulps_avx512vl(auVar65,auVar63);
  auVar65 = vpmaxsd_avx2(auVar66,auVar73);
  auVar63 = vpmaxsd_avx2(auVar67,auVar71);
  auVar65 = vminps_avx(auVar65,auVar63);
  auVar63 = vpmaxsd_avx2(auVar68,auVar60);
  uVar103 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar74._4_4_ = uVar103;
  auVar74._0_4_ = uVar103;
  auVar74._8_4_ = uVar103;
  auVar74._12_4_ = uVar103;
  auVar74._16_4_ = uVar103;
  auVar74._20_4_ = uVar103;
  auVar74._24_4_ = uVar103;
  auVar74._28_4_ = uVar103;
  auVar63 = vminps_avx512vl(auVar63,auVar74);
  auVar65 = vminps_avx(auVar65,auVar63);
  auVar75._8_4_ = 0x3f800003;
  auVar75._0_8_ = 0x3f8000033f800003;
  auVar75._12_4_ = 0x3f800003;
  auVar75._16_4_ = 0x3f800003;
  auVar75._20_4_ = 0x3f800003;
  auVar75._24_4_ = 0x3f800003;
  auVar75._28_4_ = 0x3f800003;
  auVar65 = vmulps_avx512vl(auVar65,auVar75);
  auVar244._0_32_ = vpbroadcastd_avx512vl();
  uVar12 = vpcmpgtd_avx512vl(auVar244._0_32_,_DAT_0205a920);
  uVar10 = vcmpps_avx512vl(local_400,auVar65,2);
  bVar32 = (byte)((byte)uVar10 & (byte)uVar12) == 0;
  local_761 = !bVar32;
  if (bVar32) {
    return local_761;
  }
  uVar31 = (ulong)(byte)((byte)uVar10 & (byte)uVar12);
  auVar100 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar100);
  auVar100._16_48_ = auVar244._16_48_;
  auVar34 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar252 = ZEXT1664(auVar34);
  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar244 = ZEXT1664(auVar34);
  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar245 = ZEXT1664(auVar34);
  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar246 = ZEXT1664(auVar34);
  auVar100._0_16_ = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar251 = ZEXT1664(auVar100._0_16_);
LAB_01d6c8c2:
  lVar28 = 0;
  for (uVar24 = uVar31; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
    lVar28 = lVar28 + 1;
  }
  uVar30 = *(uint *)(prim + 2);
  pGVar6 = (context->scene->geometries).items[uVar30].ptr;
  uVar24 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar28 * 4 + 6));
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar34 = *(undefined1 (*) [16])(_Var9 + uVar24 * (long)pvVar8);
  auVar45 = *(undefined1 (*) [16])(_Var9 + (uVar24 + 1) * (long)pvVar8);
  auVar44 = *(undefined1 (*) [16])(_Var9 + (uVar24 + 2) * (long)pvVar8);
  auVar43 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar24 + 3));
  lVar28 = *(long *)&pGVar6[1].time_range.upper;
  auVar42 = *(undefined1 (*) [16])(lVar28 + (long)p_Var7 * uVar24);
  auVar41 = *(undefined1 (*) [16])(lVar28 + (long)p_Var7 * (uVar24 + 1));
  auVar40 = *(undefined1 (*) [16])(lVar28 + (long)p_Var7 * (uVar24 + 2));
  uVar31 = uVar31 - 1 & uVar31;
  auVar39 = *(undefined1 (*) [16])(lVar28 + (long)p_Var7 * (uVar24 + 3));
  if (uVar31 != 0) {
    uVar29 = uVar31 - 1 & uVar31;
    for (uVar24 = uVar31; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
    }
    if (uVar29 != 0) {
      for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar3 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c
                        );
  auVar3 = vinsertps_avx(auVar3,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar243._16_48_ = auVar100._16_48_;
  auVar46 = auVar252._0_16_;
  auVar35 = vmulps_avx512vl(auVar39,auVar46);
  auVar234._8_4_ = 0x3e2aaaab;
  auVar234._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar234._12_4_ = 0x3e2aaaab;
  auVar36 = vfmadd213ps_fma(auVar234,auVar40,auVar35);
  auVar240._8_4_ = 0x3f2aaaab;
  auVar240._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar240._12_4_ = 0x3f2aaaab;
  auVar36 = vfmadd231ps_fma(auVar36,auVar41,auVar240);
  auVar47 = vfmadd231ps_fma(auVar36,auVar42,auVar234);
  auVar113 = auVar244._0_16_;
  auVar36 = vfmadd231ps_avx512vl(auVar35,auVar40,auVar113);
  auVar36 = vfnmadd231ps_avx512vl(auVar36,auVar41,auVar46);
  auVar37 = vfnmadd231ps_avx512vl(auVar36,auVar42,auVar113);
  auVar35 = vmulps_avx512vl(auVar43,auVar46);
  auVar36 = vfmadd213ps_fma(auVar234,auVar44,auVar35);
  auVar36 = vfmadd231ps_fma(auVar36,auVar45,auVar240);
  auVar36 = vfmadd231ps_fma(auVar36,auVar34,auVar234);
  auVar35 = vfmadd231ps_avx512vl(auVar35,auVar44,auVar113);
  auVar35 = vfnmadd231ps_avx512vl(auVar35,auVar45,auVar46);
  auVar38 = vfnmadd231ps_avx512vl(auVar35,auVar34,auVar113);
  auVar126._0_4_ = auVar39._0_4_ * 0.16666667;
  auVar126._4_4_ = auVar39._4_4_ * 0.16666667;
  auVar126._8_4_ = auVar39._8_4_ * 0.16666667;
  auVar126._12_4_ = auVar39._12_4_ * 0.16666667;
  auVar35 = vfmadd231ps_fma(auVar126,auVar40,auVar240);
  auVar35 = vfmadd231ps_fma(auVar35,auVar41,auVar234);
  auVar35 = vfmadd231ps_avx512vl(auVar35,auVar42,auVar46);
  auVar39 = vmulps_avx512vl(auVar39,auVar113);
  auVar40 = vfmadd231ps_avx512vl(auVar39,auVar46,auVar40);
  auVar41 = vfnmadd231ps_avx512vl(auVar40,auVar113,auVar41);
  auVar40 = vfnmadd231ps_avx512vl(auVar41,auVar46,auVar42);
  auVar184._0_4_ = auVar43._0_4_ * 0.16666667;
  auVar184._4_4_ = auVar43._4_4_ * 0.16666667;
  auVar184._8_4_ = auVar43._8_4_ * 0.16666667;
  auVar184._12_4_ = auVar43._12_4_ * 0.16666667;
  auVar42 = vfmadd231ps_fma(auVar184,auVar44,auVar240);
  auVar42 = vfmadd231ps_fma(auVar42,auVar45,auVar234);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar34,auVar46);
  auVar43 = vmulps_avx512vl(auVar43,auVar113);
  auVar44 = vfmadd231ps_avx512vl(auVar43,auVar46,auVar44);
  auVar45 = vfnmadd231ps_avx512vl(auVar44,auVar113,auVar45);
  auVar41 = vfnmadd231ps_avx512vl(auVar45,auVar46,auVar34);
  auVar34 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar45 = vshufps_avx(auVar36,auVar36,0xc9);
  fVar204 = auVar37._0_4_;
  auVar55._0_4_ = fVar204 * auVar45._0_4_;
  fVar205 = auVar37._4_4_;
  auVar55._4_4_ = fVar205 * auVar45._4_4_;
  fVar101 = auVar37._8_4_;
  auVar55._8_4_ = fVar101 * auVar45._8_4_;
  fVar102 = auVar37._12_4_;
  auVar55._12_4_ = fVar102 * auVar45._12_4_;
  auVar45 = vfmsub231ps_fma(auVar55,auVar34,auVar36);
  auVar44 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar45 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar52._0_4_ = fVar204 * auVar45._0_4_;
  auVar52._4_4_ = fVar205 * auVar45._4_4_;
  auVar52._8_4_ = fVar101 * auVar45._8_4_;
  auVar52._12_4_ = fVar102 * auVar45._12_4_;
  auVar34 = vfmsub231ps_fma(auVar52,auVar34,auVar38);
  auVar43 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar34 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar45 = vshufps_avx(auVar42,auVar42,0xc9);
  fVar125 = auVar40._0_4_;
  auVar56._0_4_ = fVar125 * auVar45._0_4_;
  fVar142 = auVar40._4_4_;
  auVar56._4_4_ = fVar142 * auVar45._4_4_;
  fVar206 = auVar40._8_4_;
  auVar56._8_4_ = fVar206 * auVar45._8_4_;
  fVar207 = auVar40._12_4_;
  auVar56._12_4_ = fVar207 * auVar45._12_4_;
  auVar45 = vfmsub231ps_fma(auVar56,auVar34,auVar42);
  auVar42 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar45 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar185._0_4_ = auVar45._0_4_ * fVar125;
  auVar185._4_4_ = auVar45._4_4_ * fVar142;
  auVar185._8_4_ = auVar45._8_4_ * fVar206;
  auVar185._12_4_ = auVar45._12_4_ * fVar207;
  auVar34 = vfmsub231ps_fma(auVar185,auVar34,auVar41);
  auVar41 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar34 = vdpps_avx(auVar44,auVar44,0x7f);
  fVar98 = auVar34._0_4_;
  auVar243._0_16_ = auVar46;
  auVar247._4_60_ = auVar243._4_60_;
  auVar247._0_4_ = fVar98;
  auVar45 = vrsqrt14ss_avx512f(auVar46,auVar247._0_16_);
  fVar209 = auVar45._0_4_;
  auVar45 = vmulss_avx512f(auVar34,ZEXT416(0xbf000000));
  fVar209 = fVar209 * 1.5 + auVar45._0_4_ * fVar209 * fVar209 * fVar209;
  fVar221 = fVar209 * auVar44._0_4_;
  fVar228 = fVar209 * auVar44._4_4_;
  fVar229 = fVar209 * auVar44._8_4_;
  fVar230 = fVar209 * auVar44._12_4_;
  auVar45 = vdpps_avx(auVar44,auVar43,0x7f);
  auVar194._0_4_ = auVar43._0_4_ * fVar98;
  auVar194._4_4_ = auVar43._4_4_ * fVar98;
  auVar194._8_4_ = auVar43._8_4_ * fVar98;
  auVar194._12_4_ = auVar43._12_4_ * fVar98;
  fVar98 = auVar45._0_4_;
  auVar156._0_4_ = fVar98 * auVar44._0_4_;
  auVar156._4_4_ = fVar98 * auVar44._4_4_;
  auVar156._8_4_ = fVar98 * auVar44._8_4_;
  auVar156._12_4_ = fVar98 * auVar44._12_4_;
  auVar44 = vsubps_avx(auVar194,auVar156);
  auVar45 = vrcp14ss_avx512f(auVar46,auVar247._0_16_);
  auVar34 = vfnmadd213ss_avx512f(auVar34,auVar45,ZEXT416(0x40000000));
  fVar208 = auVar45._0_4_ * auVar34._0_4_;
  auVar34 = vdpps_avx(auVar42,auVar42,0x7f);
  fVar193 = auVar34._0_4_;
  auVar248._16_48_ = auVar243._16_48_;
  auVar248._0_16_ = auVar46;
  auVar249._4_60_ = auVar248._4_60_;
  auVar249._0_4_ = fVar193;
  auVar45 = vrsqrt14ss_avx512f(auVar46,auVar249._0_16_);
  fVar98 = auVar45._0_4_;
  auVar45 = vmulss_avx512f(auVar34,ZEXT416(0xbf000000));
  fVar98 = fVar98 * 1.5 + auVar45._0_4_ * fVar98 * fVar98 * fVar98;
  fVar210 = fVar98 * auVar42._0_4_;
  fVar218 = fVar98 * auVar42._4_4_;
  fVar219 = fVar98 * auVar42._8_4_;
  fVar220 = fVar98 * auVar42._12_4_;
  auVar45 = vdpps_avx(auVar42,auVar41,0x7f);
  auVar53._0_4_ = fVar193 * auVar41._0_4_;
  auVar53._4_4_ = fVar193 * auVar41._4_4_;
  auVar53._8_4_ = fVar193 * auVar41._8_4_;
  auVar53._12_4_ = fVar193 * auVar41._12_4_;
  fVar193 = auVar45._0_4_;
  auVar57._0_4_ = fVar193 * auVar42._0_4_;
  auVar57._4_4_ = fVar193 * auVar42._4_4_;
  auVar57._8_4_ = fVar193 * auVar42._8_4_;
  auVar57._12_4_ = fVar193 * auVar42._12_4_;
  auVar43 = vsubps_avx(auVar53,auVar57);
  auVar45 = vrcp14ss_avx512f(auVar46,auVar249._0_16_);
  auVar34 = vfnmadd213ss_avx512f(auVar34,auVar45,ZEXT416(0x40000000));
  fVar193 = auVar34._0_4_ * auVar45._0_4_;
  auVar34 = vshufps_avx(auVar47,auVar47,0xff);
  auVar175._0_4_ = fVar221 * auVar34._0_4_;
  auVar175._4_4_ = fVar228 * auVar34._4_4_;
  auVar175._8_4_ = fVar229 * auVar34._8_4_;
  auVar175._12_4_ = fVar230 * auVar34._12_4_;
  local_4f0 = vsubps_avx(auVar47,auVar175);
  auVar45 = vshufps_avx(auVar37,auVar37,0xff);
  auVar54._0_4_ = auVar45._0_4_ * fVar221 + auVar34._0_4_ * fVar209 * fVar208 * auVar44._0_4_;
  auVar54._4_4_ = auVar45._4_4_ * fVar228 + auVar34._4_4_ * fVar209 * fVar208 * auVar44._4_4_;
  auVar54._8_4_ = auVar45._8_4_ * fVar229 + auVar34._8_4_ * fVar209 * fVar208 * auVar44._8_4_;
  auVar54._12_4_ = auVar45._12_4_ * fVar230 + auVar34._12_4_ * fVar209 * fVar208 * auVar44._12_4_;
  auVar44 = vsubps_avx(auVar37,auVar54);
  local_500._0_4_ = auVar175._0_4_ + auVar47._0_4_;
  local_500._4_4_ = auVar175._4_4_ + auVar47._4_4_;
  fStack_4f8 = auVar175._8_4_ + auVar47._8_4_;
  fStack_4f4 = auVar175._12_4_ + auVar47._12_4_;
  auVar34 = vshufps_avx(auVar35,auVar35,0xff);
  auVar149._0_4_ = fVar210 * auVar34._0_4_;
  auVar149._4_4_ = fVar218 * auVar34._4_4_;
  auVar149._8_4_ = fVar219 * auVar34._8_4_;
  auVar149._12_4_ = fVar220 * auVar34._12_4_;
  local_510 = vsubps_avx(auVar35,auVar149);
  auVar45 = vshufps_avx(auVar40,auVar40,0xff);
  auVar37._0_4_ = auVar45._0_4_ * fVar210 + auVar34._0_4_ * fVar98 * auVar43._0_4_ * fVar193;
  auVar37._4_4_ = auVar45._4_4_ * fVar218 + auVar34._4_4_ * fVar98 * auVar43._4_4_ * fVar193;
  auVar37._8_4_ = auVar45._8_4_ * fVar219 + auVar34._8_4_ * fVar98 * auVar43._8_4_ * fVar193;
  auVar37._12_4_ = auVar45._12_4_ * fVar220 + auVar34._12_4_ * fVar98 * auVar43._12_4_ * fVar193;
  auVar34 = vsubps_avx(auVar40,auVar37);
  _local_520 = vaddps_avx512vl(auVar35,auVar149);
  auVar51._0_4_ = auVar44._0_4_ * 0.33333334;
  auVar51._4_4_ = auVar44._4_4_ * 0.33333334;
  auVar51._8_4_ = auVar44._8_4_ * 0.33333334;
  auVar51._12_4_ = auVar44._12_4_ * 0.33333334;
  local_530 = vaddps_avx512vl(local_4f0,auVar51);
  auVar48._0_4_ = auVar34._0_4_ * 0.33333334;
  auVar48._4_4_ = auVar34._4_4_ * 0.33333334;
  auVar48._8_4_ = auVar34._8_4_ * 0.33333334;
  auVar48._12_4_ = auVar34._12_4_ * 0.33333334;
  local_540 = vsubps_avx512vl(local_510,auVar48);
  auVar36._0_4_ = (fVar204 + auVar54._0_4_) * 0.33333334;
  auVar36._4_4_ = (fVar205 + auVar54._4_4_) * 0.33333334;
  auVar36._8_4_ = (fVar101 + auVar54._8_4_) * 0.33333334;
  auVar36._12_4_ = (fVar102 + auVar54._12_4_) * 0.33333334;
  _local_550 = vaddps_avx512vl(_local_500,auVar36);
  auVar47._0_4_ = (fVar125 + auVar37._0_4_) * 0.33333334;
  auVar47._4_4_ = (fVar142 + auVar37._4_4_) * 0.33333334;
  auVar47._8_4_ = (fVar206 + auVar37._8_4_) * 0.33333334;
  auVar47._12_4_ = (fVar207 + auVar37._12_4_) * 0.33333334;
  _local_560 = vsubps_avx512vl(_local_520,auVar47);
  local_470 = vsubps_avx(local_4f0,auVar3);
  uVar103 = local_470._0_4_;
  auVar38._4_4_ = uVar103;
  auVar38._0_4_ = uVar103;
  auVar38._8_4_ = uVar103;
  auVar38._12_4_ = uVar103;
  auVar34 = vshufps_avx(local_470,local_470,0x55);
  auVar45 = vshufps_avx(local_470,local_470,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar209 = pre->ray_space[k].vz.field_0.m128[0];
  fVar98 = pre->ray_space[k].vz.field_0.m128[1];
  fVar208 = pre->ray_space[k].vz.field_0.m128[2];
  fVar193 = pre->ray_space[k].vz.field_0.m128[3];
  auVar35._0_4_ = fVar209 * auVar45._0_4_;
  auVar35._4_4_ = fVar98 * auVar45._4_4_;
  auVar35._8_4_ = fVar208 * auVar45._8_4_;
  auVar35._12_4_ = fVar193 * auVar45._12_4_;
  auVar34 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar34);
  auVar36 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar1,auVar38);
  local_480 = vsubps_avx512vl(local_530,auVar3);
  uVar103 = local_480._0_4_;
  auVar50._4_4_ = uVar103;
  auVar50._0_4_ = uVar103;
  auVar50._8_4_ = uVar103;
  auVar50._12_4_ = uVar103;
  auVar34 = vshufps_avx(local_480,local_480,0x55);
  auVar45 = vshufps_avx(local_480,local_480,0xaa);
  auVar113._0_4_ = fVar209 * auVar45._0_4_;
  auVar113._4_4_ = fVar98 * auVar45._4_4_;
  auVar113._8_4_ = fVar208 * auVar45._8_4_;
  auVar113._12_4_ = fVar193 * auVar45._12_4_;
  auVar34 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar2,auVar34);
  auVar47 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar1,auVar50);
  local_490 = vsubps_avx512vl(local_540,auVar3);
  uVar103 = local_490._0_4_;
  auVar58._4_4_ = uVar103;
  auVar58._0_4_ = uVar103;
  auVar58._8_4_ = uVar103;
  auVar58._12_4_ = uVar103;
  auVar34 = vshufps_avx(local_490,local_490,0x55);
  auVar45 = vshufps_avx(local_490,local_490,0xaa);
  auVar49._0_4_ = fVar209 * auVar45._0_4_;
  auVar49._4_4_ = fVar98 * auVar45._4_4_;
  auVar49._8_4_ = fVar208 * auVar45._8_4_;
  auVar49._12_4_ = fVar193 * auVar45._12_4_;
  auVar34 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar2,auVar34);
  auVar35 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar1,auVar58);
  local_4a0 = vsubps_avx(local_510,auVar3);
  uVar103 = local_4a0._0_4_;
  auVar157._4_4_ = uVar103;
  auVar157._0_4_ = uVar103;
  auVar157._8_4_ = uVar103;
  auVar157._12_4_ = uVar103;
  auVar34 = vshufps_avx(local_4a0,local_4a0,0x55);
  auVar45 = vshufps_avx(local_4a0,local_4a0,0xaa);
  auVar186._0_4_ = auVar45._0_4_ * fVar209;
  auVar186._4_4_ = auVar45._4_4_ * fVar98;
  auVar186._8_4_ = auVar45._8_4_ * fVar208;
  auVar186._12_4_ = auVar45._12_4_ * fVar193;
  auVar34 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar2,auVar34);
  auVar37 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar1,auVar157);
  local_4b0 = vsubps_avx(_local_500,auVar3);
  uVar103 = local_4b0._0_4_;
  auVar158._4_4_ = uVar103;
  auVar158._0_4_ = uVar103;
  auVar158._8_4_ = uVar103;
  auVar158._12_4_ = uVar103;
  auVar34 = vshufps_avx(local_4b0,local_4b0,0x55);
  auVar45 = vshufps_avx(local_4b0,local_4b0,0xaa);
  auVar195._0_4_ = auVar45._0_4_ * fVar209;
  auVar195._4_4_ = auVar45._4_4_ * fVar98;
  auVar195._8_4_ = auVar45._8_4_ * fVar208;
  auVar195._12_4_ = auVar45._12_4_ * fVar193;
  auVar34 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar2,auVar34);
  auVar38 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar1,auVar158);
  local_4c0 = vsubps_avx512vl(_local_550,auVar3);
  uVar103 = local_4c0._0_4_;
  auVar159._4_4_ = uVar103;
  auVar159._0_4_ = uVar103;
  auVar159._8_4_ = uVar103;
  auVar159._12_4_ = uVar103;
  auVar34 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar45 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar211._0_4_ = auVar45._0_4_ * fVar209;
  auVar211._4_4_ = auVar45._4_4_ * fVar98;
  auVar211._8_4_ = auVar45._8_4_ * fVar208;
  auVar211._12_4_ = auVar45._12_4_ * fVar193;
  auVar34 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar2,auVar34);
  auVar113 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar1,auVar159);
  local_4d0 = vsubps_avx512vl(_local_560,auVar3);
  uVar103 = local_4d0._0_4_;
  auVar160._4_4_ = uVar103;
  auVar160._0_4_ = uVar103;
  auVar160._8_4_ = uVar103;
  auVar160._12_4_ = uVar103;
  auVar34 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar45 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar222._0_4_ = auVar45._0_4_ * fVar209;
  auVar222._4_4_ = auVar45._4_4_ * fVar98;
  auVar222._8_4_ = auVar45._8_4_ * fVar208;
  auVar222._12_4_ = auVar45._12_4_ * fVar193;
  auVar34 = vfmadd231ps_fma(auVar222,(undefined1  [16])aVar2,auVar34);
  auVar126 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar1,auVar160);
  local_4e0 = vsubps_avx512vl(_local_520,auVar3);
  uVar103 = local_4e0._0_4_;
  auVar46._4_4_ = uVar103;
  auVar46._0_4_ = uVar103;
  auVar46._8_4_ = uVar103;
  auVar46._12_4_ = uVar103;
  auVar34 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar45 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar150._0_4_ = auVar45._0_4_ * fVar209;
  auVar150._4_4_ = auVar45._4_4_ * fVar98;
  auVar150._8_4_ = auVar45._8_4_ * fVar208;
  auVar150._12_4_ = auVar45._12_4_ * fVar193;
  auVar34 = vfmadd231ps_fma(auVar150,(undefined1  [16])aVar2,auVar34);
  auVar3 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar1,auVar46);
  auVar44 = vmovlhps_avx(auVar36,auVar38);
  auVar41 = vmovlhps_avx512f(auVar47,auVar113);
  auVar40 = vmovlhps_avx512f(auVar35,auVar126);
  auVar39 = vmovlhps_avx512f(auVar37,auVar3);
  auVar34 = vminps_avx512vl(auVar44,auVar41);
  auVar43 = vmaxps_avx512vl(auVar44,auVar41);
  auVar45 = vminps_avx512vl(auVar40,auVar39);
  auVar45 = vminps_avx(auVar34,auVar45);
  auVar34 = vmaxps_avx512vl(auVar40,auVar39);
  auVar34 = vmaxps_avx(auVar43,auVar34);
  auVar43 = vshufpd_avx(auVar45,auVar45,3);
  auVar42 = vshufpd_avx(auVar34,auVar34,3);
  auVar45 = vminps_avx(auVar45,auVar43);
  auVar34 = vmaxps_avx(auVar34,auVar42);
  auVar45 = vandps_avx512vl(auVar45,auVar245._0_16_);
  auVar34 = vandps_avx512vl(auVar34,auVar245._0_16_);
  auVar34 = vmaxps_avx(auVar45,auVar34);
  auVar45 = vmovshdup_avx(auVar34);
  auVar34 = vmaxss_avx(auVar45,auVar34);
  fVar98 = auVar34._0_4_ * 9.536743e-07;
  auVar161._8_8_ = auVar36._0_8_;
  auVar161._0_8_ = auVar36._0_8_;
  auVar45 = vmovddup_avx512vl(auVar47);
  auVar104._8_8_ = auVar35._0_8_;
  auVar104._0_8_ = auVar35._0_8_;
  auVar114._8_8_ = auVar37._0_8_;
  auVar114._0_8_ = auVar37._0_8_;
  local_3c0 = vbroadcastss_avx512vl(ZEXT416((uint)fVar98));
  auVar34 = vxorps_avx512vl(local_3c0._0_16_,auVar246._0_16_);
  local_3e0 = vbroadcastss_avx512vl(auVar34);
  auVar244 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar244);
  bVar32 = false;
  uVar24 = 0;
  fVar209 = *(float *)(ray + k * 4 + 0xc0);
  auVar43 = vsubps_avx512vl(auVar41,auVar44);
  auVar42 = vsubps_avx512vl(auVar40,auVar41);
  auVar81._0_16_ = vsubps_avx512vl(auVar39,auVar40);
  local_570 = vsubps_avx(_local_500,local_4f0);
  local_580 = vsubps_avx512vl(_local_550,local_530);
  local_590 = vsubps_avx512vl(_local_560,local_540);
  _local_5a0 = vsubps_avx512vl(_local_520,local_510);
  auVar244 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar244);
  auVar34 = ZEXT816(0x3f80000000000000);
  auVar243 = ZEXT1664(auVar34);
  auVar82._32_32_ = auVar244._32_32_;
  do {
    auVar50 = auVar243._0_16_;
    auVar36 = vshufps_avx(auVar50,auVar50,0x50);
    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar35 = vsubps_avx512vl(auVar66._0_16_,auVar36);
    fVar208 = auVar36._0_4_;
    fVar220 = auVar38._0_4_;
    auVar127._0_4_ = fVar220 * fVar208;
    fVar193 = auVar36._4_4_;
    fVar221 = auVar38._4_4_;
    auVar127._4_4_ = fVar221 * fVar193;
    fVar204 = auVar36._8_4_;
    auVar127._8_4_ = fVar220 * fVar204;
    fVar205 = auVar36._12_4_;
    auVar127._12_4_ = fVar221 * fVar205;
    fVar101 = auVar113._0_4_;
    auVar136._0_4_ = fVar101 * fVar208;
    fVar102 = auVar113._4_4_;
    auVar136._4_4_ = fVar102 * fVar193;
    auVar136._8_4_ = fVar101 * fVar204;
    auVar136._12_4_ = fVar102 * fVar205;
    fVar125 = auVar126._0_4_;
    auVar143._0_4_ = fVar125 * fVar208;
    fVar142 = auVar126._4_4_;
    auVar143._4_4_ = fVar142 * fVar193;
    auVar143._8_4_ = fVar125 * fVar204;
    auVar143._12_4_ = fVar142 * fVar205;
    fVar218 = auVar3._0_4_;
    auVar105._0_4_ = fVar218 * fVar208;
    fVar219 = auVar3._4_4_;
    auVar105._4_4_ = fVar219 * fVar193;
    auVar105._8_4_ = fVar218 * fVar204;
    auVar105._12_4_ = fVar219 * fVar205;
    auVar47 = vfmadd231ps_fma(auVar127,auVar35,auVar161);
    auVar37 = vfmadd231ps_avx512vl(auVar136,auVar35,auVar45);
    auVar46 = vfmadd231ps_avx512vl(auVar143,auVar35,auVar104);
    auVar35 = vfmadd231ps_fma(auVar105,auVar114,auVar35);
    auVar36 = vmovshdup_avx(auVar34);
    fVar193 = auVar34._0_4_;
    fVar208 = (auVar36._0_4_ - fVar193) * 0.04761905;
    auVar173._4_4_ = fVar193;
    auVar173._0_4_ = fVar193;
    auVar173._8_4_ = fVar193;
    auVar173._12_4_ = fVar193;
    auVar173._16_4_ = fVar193;
    auVar173._20_4_ = fVar193;
    auVar173._24_4_ = fVar193;
    auVar173._28_4_ = fVar193;
    auVar122._0_8_ = auVar36._0_8_;
    auVar122._8_8_ = auVar122._0_8_;
    auVar122._16_8_ = auVar122._0_8_;
    auVar122._24_8_ = auVar122._0_8_;
    auVar65 = vsubps_avx(auVar122,auVar173);
    uVar103 = auVar47._0_4_;
    auVar123._4_4_ = uVar103;
    auVar123._0_4_ = uVar103;
    auVar123._8_4_ = uVar103;
    auVar123._12_4_ = uVar103;
    auVar123._16_4_ = uVar103;
    auVar123._20_4_ = uVar103;
    auVar123._24_4_ = uVar103;
    auVar123._28_4_ = uVar103;
    auVar190._8_4_ = 1;
    auVar190._0_8_ = 0x100000001;
    auVar190._12_4_ = 1;
    auVar190._16_4_ = 1;
    auVar190._20_4_ = 1;
    auVar190._24_4_ = 1;
    auVar190._28_4_ = 1;
    auVar64 = ZEXT1632(auVar47);
    auVar63 = vpermps_avx2(auVar190,auVar64);
    auVar67 = vbroadcastss_avx512vl(auVar37);
    auVar74 = ZEXT1632(auVar37);
    auVar68 = vpermps_avx512vl(auVar190,auVar74);
    auVar69 = vbroadcastss_avx512vl(auVar46);
    auVar76 = ZEXT1632(auVar46);
    auVar61 = vpermps_avx512vl(auVar190,auVar76);
    auVar62 = vbroadcastss_avx512vl(auVar35);
    auVar72 = ZEXT1632(auVar35);
    auVar70 = vpermps_avx512vl(auVar190,auVar72);
    auVar191._4_4_ = fVar208;
    auVar191._0_4_ = fVar208;
    auVar191._8_4_ = fVar208;
    auVar191._12_4_ = fVar208;
    auVar191._16_4_ = fVar208;
    auVar191._20_4_ = fVar208;
    auVar191._24_4_ = fVar208;
    auVar191._28_4_ = fVar208;
    auVar233._8_4_ = 2;
    auVar233._0_8_ = 0x200000002;
    auVar233._12_4_ = 2;
    auVar233._16_4_ = 2;
    auVar233._20_4_ = 2;
    auVar233._24_4_ = 2;
    auVar233._28_4_ = 2;
    auVar59 = vpermps_avx512vl(auVar233,auVar64);
    auVar154._8_4_ = 3;
    auVar154._0_8_ = 0x300000003;
    auVar154._12_4_ = 3;
    auVar154._16_4_ = 3;
    auVar154._20_4_ = 3;
    auVar154._24_4_ = 3;
    auVar154._28_4_ = 3;
    auVar60 = vpermps_avx512vl(auVar154,auVar64);
    auVar64 = vpermps_avx2(auVar233,auVar74);
    auVar74 = vpermps_avx2(auVar154,auVar74);
    auVar75 = vpermps_avx2(auVar233,auVar76);
    auVar76 = vpermps_avx2(auVar154,auVar76);
    auVar71 = vpermps_avx512vl(auVar233,auVar72);
    auVar72 = vpermps_avx512vl(auVar154,auVar72);
    auVar36 = vfmadd132ps_fma(auVar65,auVar173,_DAT_02020f20);
    auVar66 = vsubps_avx512vl(auVar66,ZEXT1632(auVar36));
    auVar65 = vmulps_avx512vl(auVar67,ZEXT1632(auVar36));
    auVar77 = ZEXT1632(auVar36);
    auVar73 = vmulps_avx512vl(auVar68,auVar77);
    auVar47 = vfmadd231ps_fma(auVar65,auVar66,auVar123);
    auVar35 = vfmadd231ps_fma(auVar73,auVar66,auVar63);
    auVar65 = vmulps_avx512vl(auVar69,auVar77);
    auVar73 = vmulps_avx512vl(auVar61,auVar77);
    auVar65 = vfmadd231ps_avx512vl(auVar65,auVar66,auVar67);
    auVar67 = vfmadd231ps_avx512vl(auVar73,auVar66,auVar68);
    auVar68 = vmulps_avx512vl(auVar62,auVar77);
    auVar73 = ZEXT1632(auVar36);
    auVar70 = vmulps_avx512vl(auVar70,auVar73);
    auVar68 = vfmadd231ps_avx512vl(auVar68,auVar66,auVar69);
    auVar69 = vfmadd231ps_avx512vl(auVar70,auVar66,auVar61);
    fVar204 = auVar36._0_4_;
    fVar205 = auVar36._4_4_;
    auVar15._4_4_ = fVar205 * auVar65._4_4_;
    auVar15._0_4_ = fVar204 * auVar65._0_4_;
    fVar206 = auVar36._8_4_;
    auVar15._8_4_ = fVar206 * auVar65._8_4_;
    fVar207 = auVar36._12_4_;
    auVar15._12_4_ = fVar207 * auVar65._12_4_;
    auVar15._16_4_ = auVar65._16_4_ * 0.0;
    auVar15._20_4_ = auVar65._20_4_ * 0.0;
    auVar15._24_4_ = auVar65._24_4_ * 0.0;
    auVar15._28_4_ = fVar193;
    auVar16._4_4_ = fVar205 * auVar67._4_4_;
    auVar16._0_4_ = fVar204 * auVar67._0_4_;
    auVar16._8_4_ = fVar206 * auVar67._8_4_;
    auVar16._12_4_ = fVar207 * auVar67._12_4_;
    auVar16._16_4_ = auVar67._16_4_ * 0.0;
    auVar16._20_4_ = auVar67._20_4_ * 0.0;
    auVar16._24_4_ = auVar67._24_4_ * 0.0;
    auVar16._28_4_ = auVar63._28_4_;
    auVar47 = vfmadd231ps_fma(auVar15,auVar66,ZEXT1632(auVar47));
    auVar35 = vfmadd231ps_fma(auVar16,auVar66,ZEXT1632(auVar35));
    auVar111._0_4_ = fVar204 * auVar68._0_4_;
    auVar111._4_4_ = fVar205 * auVar68._4_4_;
    auVar111._8_4_ = fVar206 * auVar68._8_4_;
    auVar111._12_4_ = fVar207 * auVar68._12_4_;
    auVar111._16_4_ = auVar68._16_4_ * 0.0;
    auVar111._20_4_ = auVar68._20_4_ * 0.0;
    auVar111._24_4_ = auVar68._24_4_ * 0.0;
    auVar111._28_4_ = 0;
    auVar17._4_4_ = fVar205 * auVar69._4_4_;
    auVar17._0_4_ = fVar204 * auVar69._0_4_;
    auVar17._8_4_ = fVar206 * auVar69._8_4_;
    auVar17._12_4_ = fVar207 * auVar69._12_4_;
    auVar17._16_4_ = auVar69._16_4_ * 0.0;
    auVar17._20_4_ = auVar69._20_4_ * 0.0;
    auVar17._24_4_ = auVar69._24_4_ * 0.0;
    auVar17._28_4_ = auVar68._28_4_;
    auVar37 = vfmadd231ps_fma(auVar111,auVar66,auVar65);
    auVar46 = vfmadd231ps_fma(auVar17,auVar66,auVar67);
    auVar18._28_4_ = auVar67._28_4_;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(fVar207 * auVar46._12_4_,
                            CONCAT48(fVar206 * auVar46._8_4_,
                                     CONCAT44(fVar205 * auVar46._4_4_,fVar204 * auVar46._0_4_))));
    auVar51 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar207 * auVar37._12_4_,
                                                 CONCAT48(fVar206 * auVar37._8_4_,
                                                          CONCAT44(fVar205 * auVar37._4_4_,
                                                                   fVar204 * auVar37._0_4_)))),
                              auVar66,ZEXT1632(auVar47));
    auVar48 = vfmadd231ps_fma(auVar18,auVar66,ZEXT1632(auVar35));
    auVar65 = vsubps_avx(ZEXT1632(auVar37),ZEXT1632(auVar47));
    auVar63 = vsubps_avx(ZEXT1632(auVar46),ZEXT1632(auVar35));
    auVar67 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar65 = vmulps_avx512vl(auVar65,auVar67);
    auVar63 = vmulps_avx512vl(auVar63,auVar67);
    auVar183._0_4_ = fVar208 * auVar65._0_4_;
    auVar183._4_4_ = fVar208 * auVar65._4_4_;
    auVar183._8_4_ = fVar208 * auVar65._8_4_;
    auVar183._12_4_ = fVar208 * auVar65._12_4_;
    auVar183._16_4_ = fVar208 * auVar65._16_4_;
    auVar183._20_4_ = fVar208 * auVar65._20_4_;
    auVar183._24_4_ = fVar208 * auVar65._24_4_;
    auVar183._28_4_ = 0;
    auVar65 = vmulps_avx512vl(auVar191,auVar63);
    auVar37 = vxorps_avx512vl(auVar62._0_16_,auVar62._0_16_);
    auVar68 = vpermt2ps_avx512vl(ZEXT1632(auVar51),_DAT_0205fd20,ZEXT1632(auVar37));
    auVar69 = vpermt2ps_avx512vl(ZEXT1632(auVar48),_DAT_0205fd20,ZEXT1632(auVar37));
    auVar112._0_4_ = auVar183._0_4_ + auVar51._0_4_;
    auVar112._4_4_ = auVar183._4_4_ + auVar51._4_4_;
    auVar112._8_4_ = auVar183._8_4_ + auVar51._8_4_;
    auVar112._12_4_ = auVar183._12_4_ + auVar51._12_4_;
    auVar112._16_4_ = auVar183._16_4_ + 0.0;
    auVar112._20_4_ = auVar183._20_4_ + 0.0;
    auVar112._24_4_ = auVar183._24_4_ + 0.0;
    auVar112._28_4_ = 0;
    auVar77 = ZEXT1632(auVar37);
    auVar63 = vpermt2ps_avx512vl(auVar183,_DAT_0205fd20,auVar77);
    auVar61 = vaddps_avx512vl(ZEXT1632(auVar48),auVar65);
    auVar62 = vpermt2ps_avx512vl(auVar65,_DAT_0205fd20,auVar77);
    auVar65 = vsubps_avx(auVar68,auVar63);
    auVar62 = vsubps_avx512vl(auVar69,auVar62);
    auVar63 = vmulps_avx512vl(auVar64,auVar73);
    auVar70 = vmulps_avx512vl(auVar74,auVar73);
    auVar63 = vfmadd231ps_avx512vl(auVar63,auVar66,auVar59);
    auVar70 = vfmadd231ps_avx512vl(auVar70,auVar66,auVar60);
    auVar59 = vmulps_avx512vl(auVar75,auVar73);
    auVar60 = vmulps_avx512vl(auVar76,auVar73);
    auVar64 = vfmadd231ps_avx512vl(auVar59,auVar66,auVar64);
    auVar74 = vfmadd231ps_avx512vl(auVar60,auVar66,auVar74);
    auVar59 = vmulps_avx512vl(auVar71,auVar73);
    auVar60 = vmulps_avx512vl(auVar72,auVar73);
    auVar47 = vfmadd231ps_fma(auVar59,auVar66,auVar75);
    auVar35 = vfmadd231ps_fma(auVar60,auVar66,auVar76);
    auVar59 = vmulps_avx512vl(auVar73,auVar64);
    auVar60 = vmulps_avx512vl(ZEXT1632(auVar36),auVar74);
    auVar63 = vfmadd231ps_avx512vl(auVar59,auVar66,auVar63);
    auVar70 = vfmadd231ps_avx512vl(auVar60,auVar66,auVar70);
    auVar64 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar207 * auVar47._12_4_,
                                            CONCAT48(fVar206 * auVar47._8_4_,
                                                     CONCAT44(fVar205 * auVar47._4_4_,
                                                              fVar204 * auVar47._0_4_)))),auVar66,
                         auVar64);
    auVar74 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar207 * auVar35._12_4_,
                                            CONCAT48(fVar206 * auVar35._8_4_,
                                                     CONCAT44(fVar205 * auVar35._4_4_,
                                                              fVar204 * auVar35._0_4_)))),auVar66,
                         auVar74);
    auVar19._4_4_ = fVar205 * auVar64._4_4_;
    auVar19._0_4_ = fVar204 * auVar64._0_4_;
    auVar19._8_4_ = fVar206 * auVar64._8_4_;
    auVar19._12_4_ = fVar207 * auVar64._12_4_;
    auVar19._16_4_ = auVar64._16_4_ * 0.0;
    auVar19._20_4_ = auVar64._20_4_ * 0.0;
    auVar19._24_4_ = auVar64._24_4_ * 0.0;
    auVar19._28_4_ = auVar76._28_4_;
    auVar20._4_4_ = fVar205 * auVar74._4_4_;
    auVar20._0_4_ = fVar204 * auVar74._0_4_;
    auVar20._8_4_ = fVar206 * auVar74._8_4_;
    auVar20._12_4_ = fVar207 * auVar74._12_4_;
    auVar20._16_4_ = auVar74._16_4_ * 0.0;
    auVar20._20_4_ = auVar74._20_4_ * 0.0;
    auVar20._24_4_ = auVar74._24_4_ * 0.0;
    auVar20._28_4_ = auVar75._28_4_;
    auVar75 = vfmadd231ps_avx512vl(auVar19,auVar66,auVar63);
    auVar76 = vfmadd231ps_avx512vl(auVar20,auVar70,auVar66);
    auVar63 = vsubps_avx512vl(auVar64,auVar63);
    auVar64 = vsubps_avx512vl(auVar74,auVar70);
    auVar63 = vmulps_avx512vl(auVar63,auVar67);
    auVar64 = vmulps_avx512vl(auVar64,auVar67);
    fVar193 = fVar208 * auVar63._0_4_;
    fVar204 = fVar208 * auVar63._4_4_;
    auVar21._4_4_ = fVar204;
    auVar21._0_4_ = fVar193;
    fVar205 = fVar208 * auVar63._8_4_;
    auVar21._8_4_ = fVar205;
    fVar206 = fVar208 * auVar63._12_4_;
    auVar21._12_4_ = fVar206;
    fVar207 = fVar208 * auVar63._16_4_;
    auVar21._16_4_ = fVar207;
    fVar210 = fVar208 * auVar63._20_4_;
    auVar21._20_4_ = fVar210;
    fVar208 = fVar208 * auVar63._24_4_;
    auVar21._24_4_ = fVar208;
    auVar21._28_4_ = auVar63._28_4_;
    auVar64 = vmulps_avx512vl(auVar191,auVar64);
    auVar74 = vpermt2ps_avx512vl(auVar75,_DAT_0205fd20,auVar77);
    auVar66 = vpermt2ps_avx512vl(auVar76,_DAT_0205fd20,auVar77);
    auVar192._0_4_ = auVar75._0_4_ + fVar193;
    auVar192._4_4_ = auVar75._4_4_ + fVar204;
    auVar192._8_4_ = auVar75._8_4_ + fVar205;
    auVar192._12_4_ = auVar75._12_4_ + fVar206;
    auVar192._16_4_ = auVar75._16_4_ + fVar207;
    auVar192._20_4_ = auVar75._20_4_ + fVar210;
    auVar192._24_4_ = auVar75._24_4_ + fVar208;
    auVar192._28_4_ = auVar75._28_4_ + auVar63._28_4_;
    auVar63 = vpermt2ps_avx512vl(auVar21,_DAT_0205fd20,ZEXT1632(auVar37));
    auVar67 = vaddps_avx512vl(auVar76,auVar64);
    auVar64 = vpermt2ps_avx512vl(auVar64,_DAT_0205fd20,ZEXT1632(auVar37));
    auVar63 = vsubps_avx(auVar74,auVar63);
    auVar64 = vsubps_avx512vl(auVar66,auVar64);
    auVar133 = ZEXT1632(auVar51);
    auVar70 = vsubps_avx512vl(auVar75,auVar133);
    auVar140 = ZEXT1632(auVar48);
    auVar59 = vsubps_avx512vl(auVar76,auVar140);
    auVar60 = vsubps_avx512vl(auVar74,auVar68);
    auVar70 = vaddps_avx512vl(auVar70,auVar60);
    auVar60 = vsubps_avx512vl(auVar66,auVar69);
    auVar59 = vaddps_avx512vl(auVar59,auVar60);
    auVar60 = vmulps_avx512vl(auVar140,auVar70);
    auVar60 = vfnmadd231ps_avx512vl(auVar60,auVar133,auVar59);
    auVar71 = vmulps_avx512vl(auVar61,auVar70);
    auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar112,auVar59);
    auVar72 = vmulps_avx512vl(auVar62,auVar70);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar65,auVar59);
    auVar73 = vmulps_avx512vl(auVar69,auVar70);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar68,auVar59);
    auVar77 = vmulps_avx512vl(auVar76,auVar70);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar75,auVar59);
    auVar78 = vmulps_avx512vl(auVar67,auVar70);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar192,auVar59);
    auVar79 = vmulps_avx512vl(auVar64,auVar70);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar63,auVar59);
    auVar70 = vmulps_avx512vl(auVar66,auVar70);
    auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar74,auVar59);
    auVar59 = vminps_avx512vl(auVar60,auVar71);
    auVar60 = vmaxps_avx512vl(auVar60,auVar71);
    auVar71 = vminps_avx512vl(auVar72,auVar73);
    auVar59 = vminps_avx512vl(auVar59,auVar71);
    auVar71 = vmaxps_avx512vl(auVar72,auVar73);
    auVar60 = vmaxps_avx512vl(auVar60,auVar71);
    auVar71 = vminps_avx512vl(auVar77,auVar78);
    auVar72 = vmaxps_avx512vl(auVar77,auVar78);
    auVar73 = vminps_avx512vl(auVar79,auVar70);
    auVar71 = vminps_avx512vl(auVar71,auVar73);
    auVar59 = vminps_avx512vl(auVar59,auVar71);
    auVar70 = vmaxps_avx512vl(auVar79,auVar70);
    auVar70 = vmaxps_avx512vl(auVar72,auVar70);
    auVar70 = vmaxps_avx512vl(auVar60,auVar70);
    uVar10 = vcmpps_avx512vl(auVar59,local_3c0,2);
    uVar12 = vcmpps_avx512vl(auVar70,local_3e0,5);
    uVar26 = 0;
    bVar22 = (byte)uVar10 & (byte)uVar12 & 0x7f;
    if (bVar22 != 0) {
      auVar70 = vsubps_avx512vl(auVar68,auVar133);
      auVar59 = vsubps_avx512vl(auVar69,auVar140);
      auVar60 = vsubps_avx512vl(auVar74,auVar75);
      auVar70 = vaddps_avx512vl(auVar70,auVar60);
      auVar60 = vsubps_avx512vl(auVar66,auVar76);
      auVar59 = vaddps_avx512vl(auVar59,auVar60);
      auVar60 = vmulps_avx512vl(auVar140,auVar70);
      auVar60 = vfnmadd231ps_avx512vl(auVar60,auVar59,auVar133);
      auVar61 = vmulps_avx512vl(auVar61,auVar70);
      auVar61 = vfnmadd213ps_avx512vl(auVar112,auVar59,auVar61);
      auVar62 = vmulps_avx512vl(auVar62,auVar70);
      auVar62 = vfnmadd213ps_avx512vl(auVar65,auVar59,auVar62);
      auVar65 = vmulps_avx512vl(auVar69,auVar70);
      auVar68 = vfnmadd231ps_avx512vl(auVar65,auVar59,auVar68);
      auVar65 = vmulps_avx512vl(auVar76,auVar70);
      auVar75 = vfnmadd231ps_avx512vl(auVar65,auVar59,auVar75);
      auVar65 = vmulps_avx512vl(auVar67,auVar70);
      auVar76 = vfnmadd213ps_avx512vl(auVar192,auVar59,auVar65);
      auVar65 = vmulps_avx512vl(auVar64,auVar70);
      auVar67 = vfnmadd213ps_avx512vl(auVar63,auVar59,auVar65);
      auVar65 = vmulps_avx512vl(auVar66,auVar70);
      auVar66 = vfnmadd231ps_avx512vl(auVar65,auVar74,auVar59);
      auVar63 = vminps_avx(auVar60,auVar61);
      auVar65 = vmaxps_avx(auVar60,auVar61);
      auVar64 = vminps_avx(auVar62,auVar68);
      auVar64 = vminps_avx(auVar63,auVar64);
      auVar63 = vmaxps_avx(auVar62,auVar68);
      auVar65 = vmaxps_avx(auVar65,auVar63);
      auVar74 = vminps_avx(auVar75,auVar76);
      auVar63 = vmaxps_avx(auVar75,auVar76);
      auVar75 = vminps_avx(auVar67,auVar66);
      auVar74 = vminps_avx(auVar74,auVar75);
      auVar74 = vminps_avx(auVar64,auVar74);
      auVar64 = vmaxps_avx(auVar67,auVar66);
      auVar63 = vmaxps_avx(auVar63,auVar64);
      auVar65 = vmaxps_avx(auVar65,auVar63);
      uVar10 = vcmpps_avx512vl(auVar65,local_3e0,5);
      uVar12 = vcmpps_avx512vl(auVar74,local_3c0,2);
      uVar26 = (uint)(bVar22 & (byte)uVar10 & (byte)uVar12);
    }
    if (uVar26 != 0) {
      auStack_5e0[uVar24] = uVar26;
      uVar10 = vmovlps_avx(auVar34);
      *(undefined8 *)(&uStack_460 + uVar24 * 2) = uVar10;
      uVar29 = vmovlps_avx512f(auVar50);
      auStack_3a0[uVar24] = uVar29;
      uVar24 = (ulong)((int)uVar24 + 1);
    }
    auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar244 = ZEXT1664(auVar34);
    auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar245 = ZEXT1664(auVar34);
    auVar34 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar246 = ZEXT1664(auVar34);
    auVar80._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar80._32_32_ = auVar82._32_32_;
    auVar247 = ZEXT3264(auVar80._0_32_);
    auVar248 = ZEXT464(0x3f800000);
    auVar81._16_48_ = auVar80._16_48_;
    auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar249 = ZEXT1664(auVar34);
    auVar100 = auVar81;
    do {
      auVar36 = auVar252._0_16_;
      auVar34 = auVar249._0_16_;
      if ((int)uVar24 == 0) {
        if (bVar32) {
          return local_761;
        }
        uVar103 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar14._4_4_ = uVar103;
        auVar14._0_4_ = uVar103;
        auVar14._8_4_ = uVar103;
        auVar14._12_4_ = uVar103;
        auVar14._16_4_ = uVar103;
        auVar14._20_4_ = uVar103;
        auVar14._24_4_ = uVar103;
        auVar14._28_4_ = uVar103;
        uVar10 = vcmpps_avx512vl(local_400,auVar14,2);
        uVar30 = (uint)uVar31 & (uint)uVar10;
        uVar31 = (ulong)uVar30;
        local_761 = uVar30 != 0;
        if (!local_761) {
          return local_761;
        }
        goto LAB_01d6c8c2;
      }
      uVar23 = (int)uVar24 - 1;
      uVar25 = (ulong)uVar23;
      uVar26 = (&uStack_460)[uVar25 * 2];
      fVar208 = afStack_45c[uVar25 * 2];
      uVar5 = auStack_5e0[uVar25];
      auVar241._8_8_ = 0;
      auVar241._0_8_ = auStack_3a0[uVar25];
      auVar243 = ZEXT1664(auVar241);
      lVar28 = 0;
      for (uVar29 = (ulong)uVar5; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
        lVar28 = lVar28 + 1;
      }
      uVar27 = uVar5 - 1 & uVar5;
      auStack_5e0[uVar25] = uVar27;
      if (uVar27 == 0) {
        uVar24 = (ulong)uVar23;
      }
      auVar115._0_4_ = (float)lVar28;
      auVar115._4_8_ = SUB128(ZEXT812(0),4);
      auVar115._12_4_ = 0;
      auVar82._32_32_ = auVar100._32_32_;
      auVar35 = vmulss_avx512f(auVar115,SUB6416(ZEXT464(0x3e124925),0));
      lVar28 = lVar28 + 1;
      auVar47 = vcvtsi2ss_avx512f(auVar36,lVar28);
      auVar47 = vmulss_avx512f(auVar47,SUB6416(ZEXT464(0x3e124925),0));
      auVar46 = auVar248._0_16_;
      auVar37 = vsubss_avx512f(auVar46,auVar35);
      auVar35 = vmulss_avx512f(ZEXT416((uint)fVar208),auVar35);
      auVar96._0_16_ = vfmadd231ss_avx512f(auVar35,ZEXT416(uVar26),auVar37);
      auVar35 = vsubss_avx512f(auVar46,auVar47);
      auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * auVar47._0_4_)),ZEXT416(uVar26),auVar35);
      auVar35 = vsubss_avx512f(auVar47,auVar96._0_16_);
      vucomiss_avx512f(auVar35);
      if (uVar5 == 0 || lVar28 == 0) break;
      auVar37 = vshufps_avx(auVar241,auVar241,0x50);
      vucomiss_avx512f(auVar35);
      auVar48 = vsubps_avx512vl(auVar34,auVar37);
      fVar208 = auVar37._0_4_;
      auVar128._0_4_ = fVar220 * fVar208;
      fVar193 = auVar37._4_4_;
      auVar128._4_4_ = fVar221 * fVar193;
      fVar204 = auVar37._8_4_;
      auVar128._8_4_ = fVar220 * fVar204;
      fVar205 = auVar37._12_4_;
      auVar128._12_4_ = fVar221 * fVar205;
      auVar137._0_4_ = fVar101 * fVar208;
      auVar137._4_4_ = fVar102 * fVar193;
      auVar137._8_4_ = fVar101 * fVar204;
      auVar137._12_4_ = fVar102 * fVar205;
      auVar144._0_4_ = fVar125 * fVar208;
      auVar144._4_4_ = fVar142 * fVar193;
      auVar144._8_4_ = fVar125 * fVar204;
      auVar144._12_4_ = fVar142 * fVar205;
      auVar106._0_4_ = fVar218 * fVar208;
      auVar106._4_4_ = fVar219 * fVar193;
      auVar106._8_4_ = fVar218 * fVar204;
      auVar106._12_4_ = fVar219 * fVar205;
      auVar37 = vfmadd231ps_fma(auVar128,auVar48,auVar161);
      auVar51 = vfmadd231ps_fma(auVar137,auVar48,auVar45);
      auVar49 = vfmadd231ps_avx512vl(auVar144,auVar48,auVar104);
      auVar48 = vfmadd231ps_fma(auVar106,auVar114,auVar48);
      auVar124._16_16_ = auVar37;
      auVar124._0_16_ = auVar37;
      auVar134._16_16_ = auVar51;
      auVar134._0_16_ = auVar51;
      auVar141._16_16_ = auVar49;
      auVar141._0_16_ = auVar49;
      auVar155._0_4_ = auVar96._0_4_;
      auVar155._4_4_ = auVar155._0_4_;
      auVar155._8_4_ = auVar155._0_4_;
      auVar155._12_4_ = auVar155._0_4_;
      uVar103 = auVar47._0_4_;
      auVar155._20_4_ = uVar103;
      auVar155._16_4_ = uVar103;
      auVar155._24_4_ = uVar103;
      auVar155._28_4_ = uVar103;
      auVar65 = vsubps_avx(auVar134,auVar124);
      auVar51 = vfmadd213ps_fma(auVar65,auVar155,auVar124);
      auVar65 = vsubps_avx(auVar141,auVar134);
      auVar50 = vfmadd213ps_fma(auVar65,auVar155,auVar134);
      auVar37 = vsubps_avx(auVar48,auVar49);
      auVar135._16_16_ = auVar37;
      auVar135._0_16_ = auVar37;
      auVar37 = vfmadd213ps_fma(auVar135,auVar155,auVar141);
      auVar65 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar51));
      auVar51 = vfmadd213ps_fma(auVar65,auVar155,ZEXT1632(auVar51));
      auVar65 = vsubps_avx(ZEXT1632(auVar37),ZEXT1632(auVar50));
      auVar37 = vfmadd213ps_fma(auVar65,auVar155,ZEXT1632(auVar50));
      auVar65 = vsubps_avx(ZEXT1632(auVar37),ZEXT1632(auVar51));
      auVar156 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar65,auVar155);
      auVar82._0_32_ = vmulps_avx512vl(auVar65,auVar247._0_32_);
      fVar208 = auVar35._0_4_ * 0.33333334;
      auVar145._0_8_ =
           CONCAT44(auVar156._4_4_ + fVar208 * auVar82._4_4_,
                    auVar156._0_4_ + fVar208 * auVar82._0_4_);
      auVar145._8_4_ = auVar156._8_4_ + fVar208 * auVar82._8_4_;
      auVar145._12_4_ = auVar156._12_4_ + fVar208 * auVar82._12_4_;
      auVar129._0_4_ = fVar208 * auVar82._16_4_;
      auVar129._4_4_ = fVar208 * auVar82._20_4_;
      auVar129._8_4_ = fVar208 * auVar82._24_4_;
      auVar129._12_4_ = fVar208 * auVar82._28_4_;
      auVar149 = vsubps_avx((undefined1  [16])0x0,auVar129);
      auVar57 = vshufpd_avx(auVar156,auVar156,3);
      auVar55 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar37 = vsubps_avx(auVar57,auVar156);
      auVar51 = vsubps_avx(auVar55,(undefined1  [16])0x0);
      auVar162._0_4_ = auVar51._0_4_ + auVar37._0_4_;
      auVar162._4_4_ = auVar51._4_4_ + auVar37._4_4_;
      auVar162._8_4_ = auVar51._8_4_ + auVar37._8_4_;
      auVar162._12_4_ = auVar51._12_4_ + auVar37._12_4_;
      auVar37 = vshufps_avx(auVar156,auVar156,0xb1);
      auVar51 = vshufps_avx(auVar145,auVar145,0xb1);
      auVar48 = vshufps_avx(auVar149,auVar149,0xb1);
      auVar50 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar223._4_4_ = auVar162._0_4_;
      auVar223._0_4_ = auVar162._0_4_;
      auVar223._8_4_ = auVar162._0_4_;
      auVar223._12_4_ = auVar162._0_4_;
      auVar49 = vshufps_avx(auVar162,auVar162,0x55);
      fVar208 = auVar49._0_4_;
      auVar176._0_4_ = auVar37._0_4_ * fVar208;
      fVar193 = auVar49._4_4_;
      auVar176._4_4_ = auVar37._4_4_ * fVar193;
      fVar204 = auVar49._8_4_;
      auVar176._8_4_ = auVar37._8_4_ * fVar204;
      fVar205 = auVar49._12_4_;
      auVar176._12_4_ = auVar37._12_4_ * fVar205;
      auVar187._0_4_ = auVar51._0_4_ * fVar208;
      auVar187._4_4_ = auVar51._4_4_ * fVar193;
      auVar187._8_4_ = auVar51._8_4_ * fVar204;
      auVar187._12_4_ = auVar51._12_4_ * fVar205;
      auVar196._0_4_ = auVar48._0_4_ * fVar208;
      auVar196._4_4_ = auVar48._4_4_ * fVar193;
      auVar196._8_4_ = auVar48._8_4_ * fVar204;
      auVar196._12_4_ = auVar48._12_4_ * fVar205;
      auVar163._0_4_ = auVar50._0_4_ * fVar208;
      auVar163._4_4_ = auVar50._4_4_ * fVar193;
      auVar163._8_4_ = auVar50._8_4_ * fVar204;
      auVar163._12_4_ = auVar50._12_4_ * fVar205;
      auVar37 = vfmadd231ps_fma(auVar176,auVar223,auVar156);
      auVar51 = vfmadd231ps_fma(auVar187,auVar223,auVar145);
      auVar49 = vfmadd231ps_fma(auVar196,auVar223,auVar149);
      auVar150 = vfmadd231ps_fma(auVar163,(undefined1  [16])0x0,auVar223);
      auVar56 = vshufpd_avx(auVar37,auVar37,1);
      auVar52 = vshufpd_avx(auVar51,auVar51,1);
      auVar53 = vshufpd_avx(auVar49,auVar49,1);
      auVar54 = vshufpd_avx(auVar150,auVar150,1);
      auVar48 = vminss_avx(auVar37,auVar51);
      auVar37 = vmaxss_avx(auVar51,auVar37);
      auVar50 = vminss_avx(auVar49,auVar150);
      auVar51 = vmaxss_avx(auVar150,auVar49);
      auVar50 = vminss_avx(auVar48,auVar50);
      auVar37 = vmaxss_avx(auVar51,auVar37);
      auVar49 = vminss_avx(auVar56,auVar52);
      auVar51 = vmaxss_avx(auVar52,auVar56);
      auVar56 = vminss_avx(auVar53,auVar54);
      auVar48 = vmaxss_avx(auVar54,auVar53);
      auVar49 = vminss_avx(auVar49,auVar56);
      auVar51 = vmaxss_avx(auVar48,auVar51);
      fVar204 = auVar50._0_4_;
      auVar84._16_48_ = auVar82._16_48_;
      fVar193 = auVar51._0_4_;
      fVar208 = auVar37._0_4_;
      if ((0.0001 <= fVar204) || (fVar193 <= -0.0001)) {
        uVar10 = vcmpps_avx512vl(auVar49,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar12 = vcmpps_avx512vl(auVar50,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar208 & ((byte)uVar12 | (byte)uVar10)) != 0) goto LAB_01d6d827;
        uVar10 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar51,5);
        uVar12 = vcmpps_avx512vl(auVar49,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar12 | (ushort)uVar10) & 1) == 0) goto LAB_01d6d827;
        bVar11 = true;
        auVar243 = ZEXT1664(auVar241);
        auVar96._16_48_ = auVar84._16_48_;
        auVar100 = auVar96;
      }
      else {
LAB_01d6d827:
        auVar52 = auVar251._0_16_;
        uVar10 = vcmpss_avx512f(auVar50,auVar52,1);
        bVar11 = (bool)((byte)uVar10 & 1);
        iVar97 = auVar248._0_4_;
        fVar205 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar97);
        uVar10 = vcmpss_avx512f(auVar37,auVar52,1);
        bVar11 = (bool)((byte)uVar10 & 1);
        fVar206 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar97);
        bVar11 = fVar205 != fVar206;
        iVar250 = auVar251._0_4_;
        auVar84._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar83._4_60_ = auVar84._4_60_;
        auVar83._0_4_ = (uint)bVar11 * iVar250 + (uint)!bVar11 * 0x7f800000;
        auVar56 = auVar83._0_16_;
        auVar86._16_48_ = auVar84._16_48_;
        auVar86._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar85._4_60_ = auVar86._4_60_;
        auVar85._0_4_ = (uint)bVar11 * iVar250 + (uint)!bVar11 * -0x800000;
        auVar48 = auVar85._0_16_;
        uVar10 = vcmpss_avx512f(auVar49,auVar52,1);
        bVar11 = (bool)((byte)uVar10 & 1);
        fVar207 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar97);
        if ((fVar205 != fVar207) || (NAN(fVar205) || NAN(fVar207))) {
          fVar205 = auVar49._0_4_;
          bVar11 = fVar205 == fVar204;
          if ((!bVar11) || (NAN(fVar205) || NAN(fVar204))) {
            auVar50 = vxorps_avx512vl(auVar50,auVar246._0_16_);
            auVar235._0_4_ = auVar50._0_4_ / (fVar205 - fVar204);
            auVar235._4_12_ = auVar50._4_12_;
            auVar50 = vsubss_avx512f(auVar46,auVar235);
            auVar49 = vfmadd213ss_avx512f(auVar50,auVar52,auVar235);
            auVar50 = auVar49;
          }
          else {
            vucomiss_avx512f(auVar52);
            auVar88._16_48_ = auVar84._16_48_;
            auVar88._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar87._4_60_ = auVar88._4_60_;
            auVar87._0_4_ = (uint)bVar11 * iVar250 + (uint)!bVar11 * 0x7f800000;
            auVar49 = auVar87._0_16_;
            auVar50 = ZEXT416((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * -0x800000);
          }
          auVar56 = vminss_avx(auVar56,auVar49);
          auVar48 = vmaxss_avx(auVar50,auVar48);
        }
        auVar243 = ZEXT1664(auVar241);
        uVar10 = vcmpss_avx512f(auVar51,auVar52,1);
        bVar11 = (bool)((byte)uVar10 & 1);
        fVar204 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar97);
        if ((fVar206 != fVar204) || (NAN(fVar206) || NAN(fVar204))) {
          bVar11 = fVar193 == fVar208;
          if ((!bVar11) || (NAN(fVar193) || NAN(fVar208))) {
            auVar37 = vxorps_avx512vl(auVar37,auVar246._0_16_);
            auVar197._0_4_ = auVar37._0_4_ / (fVar193 - fVar208);
            auVar197._4_12_ = auVar37._4_12_;
            auVar37 = vsubss_avx512f(auVar46,auVar197);
            auVar51 = vfmadd213ss_avx512f(auVar37,auVar52,auVar197);
            auVar37 = auVar51;
          }
          else {
            vucomiss_avx512f(auVar52);
            auVar90._16_48_ = auVar84._16_48_;
            auVar90._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar89._4_60_ = auVar90._4_60_;
            auVar89._0_4_ = (uint)bVar11 * iVar250 + (uint)!bVar11 * 0x7f800000;
            auVar51 = auVar89._0_16_;
            auVar37 = ZEXT416((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * -0x800000);
          }
          auVar56 = vminss_avx(auVar56,auVar51);
          auVar48 = vmaxss_avx(auVar37,auVar48);
        }
        bVar11 = fVar207 != fVar204;
        auVar37 = vminss_avx512f(auVar56,auVar46);
        auVar92._16_48_ = auVar84._16_48_;
        auVar92._0_16_ = auVar56;
        auVar91._4_60_ = auVar92._4_60_;
        auVar91._0_4_ = (uint)bVar11 * auVar37._0_4_ + (uint)!bVar11 * auVar56._0_4_;
        auVar37 = vmaxss_avx512f(auVar46,auVar48);
        auVar94._16_48_ = auVar84._16_48_;
        auVar94._0_16_ = auVar48;
        auVar93._4_60_ = auVar94._4_60_;
        auVar93._0_4_ = (uint)bVar11 * auVar37._0_4_ + (uint)!bVar11 * auVar48._0_4_;
        auVar37 = vmaxss_avx512f(auVar52,auVar91._0_16_);
        auVar51 = vminss_avx512f(auVar93._0_16_,auVar46);
        bVar11 = true;
        if (auVar37._0_4_ <= auVar51._0_4_) {
          auVar52 = vmaxss_avx512f(auVar52,ZEXT416((uint)(auVar37._0_4_ + -0.1)));
          auVar53 = vminss_avx512f(ZEXT416((uint)(auVar51._0_4_ + 0.1)),auVar46);
          auVar107._0_8_ = auVar156._0_8_;
          auVar107._8_8_ = auVar107._0_8_;
          auVar188._8_8_ = auVar145._0_8_;
          auVar188._0_8_ = auVar145._0_8_;
          auVar198._8_8_ = auVar149._0_8_;
          auVar198._0_8_ = auVar149._0_8_;
          auVar37 = vshufpd_avx(auVar145,auVar145,3);
          auVar51 = vshufpd_avx(auVar149,auVar149,3);
          auVar48 = vshufps_avx(auVar52,auVar53,0);
          auVar54 = vsubps_avx512vl(auVar34,auVar48);
          fVar208 = auVar48._0_4_;
          auVar231._0_4_ = fVar208 * auVar57._0_4_;
          fVar193 = auVar48._4_4_;
          auVar231._4_4_ = fVar193 * auVar57._4_4_;
          fVar204 = auVar48._8_4_;
          auVar231._8_4_ = fVar204 * auVar57._8_4_;
          fVar205 = auVar48._12_4_;
          auVar231._12_4_ = fVar205 * auVar57._12_4_;
          auVar146._0_4_ = fVar208 * auVar37._0_4_;
          auVar146._4_4_ = fVar193 * auVar37._4_4_;
          auVar146._8_4_ = fVar204 * auVar37._8_4_;
          auVar146._12_4_ = fVar205 * auVar37._12_4_;
          auVar151._0_4_ = fVar208 * auVar51._0_4_;
          auVar151._4_4_ = fVar193 * auVar51._4_4_;
          auVar151._8_4_ = fVar204 * auVar51._8_4_;
          auVar151._12_4_ = fVar205 * auVar51._12_4_;
          auVar130._0_4_ = fVar208 * auVar55._0_4_;
          auVar130._4_4_ = fVar193 * auVar55._4_4_;
          auVar130._8_4_ = fVar204 * auVar55._8_4_;
          auVar130._12_4_ = fVar205 * auVar55._12_4_;
          auVar50 = vfmadd231ps_fma(auVar231,auVar54,auVar107);
          auVar49 = vfmadd231ps_fma(auVar146,auVar54,auVar188);
          auVar56 = vfmadd231ps_fma(auVar151,auVar54,auVar198);
          auVar57 = vfmadd231ps_fma(auVar130,auVar54,ZEXT816(0));
          auVar51 = vsubss_avx512f(auVar46,auVar52);
          auVar37 = vmovshdup_avx(auVar241);
          auVar150 = vfmadd231ss_fma(ZEXT416((uint)(auVar37._0_4_ * auVar52._0_4_)),auVar241,auVar51
                                    );
          auVar51 = vsubss_avx512f(auVar46,auVar53);
          auVar156 = vfmadd231ss_fma(ZEXT416((uint)(auVar53._0_4_ * auVar37._0_4_)),auVar241,auVar51
                                    );
          auVar55 = vdivss_avx512f(auVar46,auVar35);
          auVar35 = vsubps_avx(auVar49,auVar50);
          auVar116._0_4_ = auVar35._0_4_ * 3.0;
          auVar116._4_4_ = auVar35._4_4_ * 3.0;
          auVar116._8_4_ = auVar35._8_4_ * 3.0;
          auVar116._12_4_ = auVar35._12_4_ * 3.0;
          auVar35 = vsubps_avx(auVar56,auVar49);
          auVar164._0_4_ = auVar35._0_4_ * 3.0;
          auVar164._4_4_ = auVar35._4_4_ * 3.0;
          auVar164._8_4_ = auVar35._8_4_ * 3.0;
          auVar164._12_4_ = auVar35._12_4_ * 3.0;
          auVar35 = vsubps_avx(auVar57,auVar56);
          auVar177._0_4_ = auVar35._0_4_ * 3.0;
          auVar177._4_4_ = auVar35._4_4_ * 3.0;
          auVar177._8_4_ = auVar35._8_4_ * 3.0;
          auVar177._12_4_ = auVar35._12_4_ * 3.0;
          auVar37 = vminps_avx(auVar164,auVar177);
          auVar35 = vmaxps_avx(auVar164,auVar177);
          auVar37 = vminps_avx(auVar116,auVar37);
          auVar35 = vmaxps_avx(auVar116,auVar35);
          auVar51 = vshufpd_avx(auVar37,auVar37,3);
          auVar48 = vshufpd_avx(auVar35,auVar35,3);
          auVar37 = vminps_avx(auVar37,auVar51);
          auVar35 = vmaxps_avx(auVar35,auVar48);
          fVar208 = auVar55._0_4_;
          auVar178._0_4_ = fVar208 * auVar37._0_4_;
          auVar178._4_4_ = fVar208 * auVar37._4_4_;
          auVar178._8_4_ = fVar208 * auVar37._8_4_;
          auVar178._12_4_ = fVar208 * auVar37._12_4_;
          auVar165._0_4_ = fVar208 * auVar35._0_4_;
          auVar165._4_4_ = fVar208 * auVar35._4_4_;
          auVar165._8_4_ = fVar208 * auVar35._8_4_;
          auVar165._12_4_ = fVar208 * auVar35._12_4_;
          auVar55 = vdivss_avx512f(auVar46,ZEXT416((uint)(auVar156._0_4_ - auVar150._0_4_)));
          auVar35 = vshufpd_avx(auVar50,auVar50,3);
          auVar37 = vshufpd_avx(auVar49,auVar49,3);
          auVar51 = vshufpd_avx(auVar56,auVar56,3);
          auVar48 = vshufpd_avx(auVar57,auVar57,3);
          auVar35 = vsubps_avx(auVar35,auVar50);
          auVar50 = vsubps_avx(auVar37,auVar49);
          auVar49 = vsubps_avx(auVar51,auVar56);
          auVar48 = vsubps_avx(auVar48,auVar57);
          auVar37 = vminps_avx(auVar35,auVar50);
          auVar35 = vmaxps_avx(auVar35,auVar50);
          auVar51 = vminps_avx(auVar49,auVar48);
          auVar51 = vminps_avx(auVar37,auVar51);
          auVar37 = vmaxps_avx(auVar49,auVar48);
          auVar35 = vmaxps_avx(auVar35,auVar37);
          fVar208 = auVar55._0_4_;
          auVar199._0_4_ = fVar208 * auVar51._0_4_;
          auVar199._4_4_ = fVar208 * auVar51._4_4_;
          auVar199._8_4_ = fVar208 * auVar51._8_4_;
          auVar199._12_4_ = fVar208 * auVar51._12_4_;
          auVar212._0_4_ = fVar208 * auVar35._0_4_;
          auVar212._4_4_ = fVar208 * auVar35._4_4_;
          auVar212._8_4_ = fVar208 * auVar35._8_4_;
          auVar212._12_4_ = fVar208 * auVar35._12_4_;
          auVar149 = vinsertps_avx512f(auVar96._0_16_,auVar150,0x10);
          auVar50 = vinsertps_avx(auVar47,auVar156,0x10);
          auVar99._0_4_ = auVar149._0_4_ + auVar50._0_4_;
          auVar99._4_4_ = auVar149._4_4_ + auVar50._4_4_;
          auVar99._8_4_ = auVar149._8_4_ + auVar50._8_4_;
          auVar99._12_4_ = auVar149._12_4_ + auVar50._12_4_;
          auVar53 = vmulps_avx512vl(auVar99,auVar244._0_16_);
          auVar51 = vshufps_avx(auVar53,auVar53,0x54);
          uVar103 = auVar53._0_4_;
          auVar117._4_4_ = uVar103;
          auVar117._0_4_ = uVar103;
          auVar117._8_4_ = uVar103;
          auVar117._12_4_ = uVar103;
          auVar49 = vfmadd213ps_avx512vl(auVar43,auVar117,auVar44);
          auVar37 = vfmadd213ps_fma(auVar42,auVar117,auVar41);
          auVar48 = vfmadd213ps_fma(auVar81._0_16_,auVar117,auVar40);
          auVar35 = vsubps_avx(auVar37,auVar49);
          auVar49 = vfmadd213ps_fma(auVar35,auVar117,auVar49);
          auVar35 = vsubps_avx(auVar48,auVar37);
          auVar35 = vfmadd213ps_fma(auVar35,auVar117,auVar37);
          auVar35 = vsubps_avx(auVar35,auVar49);
          auVar37 = vfmadd231ps_fma(auVar49,auVar35,auVar117);
          auVar118._0_8_ = CONCAT44(auVar35._4_4_ * 3.0,auVar35._0_4_ * 3.0);
          auVar118._8_4_ = auVar35._8_4_ * 3.0;
          auVar118._12_4_ = auVar35._12_4_ * 3.0;
          auVar224._8_8_ = auVar37._0_8_;
          auVar224._0_8_ = auVar37._0_8_;
          auVar35 = vshufpd_avx(auVar37,auVar37,3);
          auVar37 = vshufps_avx(auVar53,auVar53,0x55);
          auVar48 = vsubps_avx(auVar35,auVar224);
          auVar49 = vfmadd231ps_fma(auVar224,auVar37,auVar48);
          auVar236._8_8_ = auVar118._0_8_;
          auVar236._0_8_ = auVar118._0_8_;
          auVar35 = vshufpd_avx(auVar118,auVar118,3);
          auVar35 = vsubps_avx(auVar35,auVar236);
          auVar37 = vfmadd213ps_fma(auVar35,auVar37,auVar236);
          auVar119._0_8_ = auVar48._0_8_ ^ 0x8000000080000000;
          auVar119._8_4_ = auVar48._8_4_ ^ 0x80000000;
          auVar119._12_4_ = auVar48._12_4_ ^ 0x80000000;
          auVar35 = vmovshdup_avx(auVar37);
          auVar237._0_8_ = auVar35._0_8_ ^ 0x8000000080000000;
          auVar237._8_4_ = auVar35._8_4_ ^ 0x80000000;
          auVar237._12_4_ = auVar35._12_4_ ^ 0x80000000;
          auVar56 = vmovshdup_avx512vl(auVar48);
          auVar57 = vpermt2ps_avx512vl(auVar237,ZEXT416(5),auVar48);
          auVar35 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar35._0_4_ * auVar48._0_4_)),auVar37,
                                        auVar56);
          auVar37 = vpermt2ps_avx512vl(auVar37,SUB6416(ZEXT464(4),0),auVar119);
          auVar131._0_4_ = auVar35._0_4_;
          auVar131._4_4_ = auVar131._0_4_;
          auVar131._8_4_ = auVar131._0_4_;
          auVar131._12_4_ = auVar131._0_4_;
          auVar35 = vdivps_avx(auVar57,auVar131);
          auVar37 = vdivps_avx(auVar37,auVar131);
          fVar193 = auVar49._0_4_;
          auVar48 = vshufps_avx(auVar49,auVar49,0x55);
          fVar208 = auVar37._0_4_;
          auVar225._0_4_ = fVar193 * auVar35._0_4_ + auVar48._0_4_ * fVar208;
          auVar225._4_4_ = fVar193 * auVar35._4_4_ + auVar48._4_4_ * auVar37._4_4_;
          auVar225._8_4_ = fVar193 * auVar35._8_4_ + auVar48._8_4_ * auVar37._8_4_;
          auVar225._12_4_ = fVar193 * auVar35._12_4_ + auVar48._12_4_ * auVar37._12_4_;
          auVar54 = vsubps_avx(auVar51,auVar225);
          auVar49 = vmovshdup_avx(auVar35);
          auVar51 = vinsertps_avx(auVar178,auVar199,0x1c);
          auVar238._0_4_ = auVar49._0_4_ * auVar51._0_4_;
          auVar238._4_4_ = auVar49._4_4_ * auVar51._4_4_;
          auVar238._8_4_ = auVar49._8_4_ * auVar51._8_4_;
          auVar238._12_4_ = auVar49._12_4_ * auVar51._12_4_;
          auVar48 = vinsertps_avx(auVar165,auVar212,0x1c);
          auVar226._0_4_ = auVar49._0_4_ * auVar48._0_4_;
          auVar226._4_4_ = auVar49._4_4_ * auVar48._4_4_;
          auVar226._8_4_ = auVar49._8_4_ * auVar48._8_4_;
          auVar226._12_4_ = auVar49._12_4_ * auVar48._12_4_;
          auVar52 = vminps_avx512vl(auVar238,auVar226);
          auVar57 = vmaxps_avx(auVar226,auVar238);
          auVar55 = vmovshdup_avx(auVar37);
          auVar49 = vinsertps_avx(auVar199,auVar178,0x4c);
          auVar200._0_4_ = auVar55._0_4_ * auVar49._0_4_;
          auVar200._4_4_ = auVar55._4_4_ * auVar49._4_4_;
          auVar200._8_4_ = auVar55._8_4_ * auVar49._8_4_;
          auVar200._12_4_ = auVar55._12_4_ * auVar49._12_4_;
          auVar56 = vinsertps_avx(auVar212,auVar165,0x4c);
          auVar213._0_4_ = auVar55._0_4_ * auVar56._0_4_;
          auVar213._4_4_ = auVar55._4_4_ * auVar56._4_4_;
          auVar213._8_4_ = auVar55._8_4_ * auVar56._8_4_;
          auVar213._12_4_ = auVar55._12_4_ * auVar56._12_4_;
          auVar55 = vminps_avx(auVar200,auVar213);
          auVar52 = vaddps_avx512vl(auVar52,auVar55);
          auVar55 = vmaxps_avx(auVar213,auVar200);
          auVar201._0_4_ = auVar57._0_4_ + auVar55._0_4_;
          auVar201._4_4_ = auVar57._4_4_ + auVar55._4_4_;
          auVar201._8_4_ = auVar57._8_4_ + auVar55._8_4_;
          auVar201._12_4_ = auVar57._12_4_ + auVar55._12_4_;
          auVar214._8_8_ = 0x3f80000000000000;
          auVar214._0_8_ = 0x3f80000000000000;
          auVar57 = vsubps_avx(auVar214,auVar201);
          auVar55 = vsubps_avx(auVar214,auVar52);
          auVar52 = vsubps_avx(auVar149,auVar53);
          auVar53 = vsubps_avx(auVar50,auVar53);
          fVar207 = auVar52._0_4_;
          auVar239._0_4_ = fVar207 * auVar57._0_4_;
          fVar210 = auVar52._4_4_;
          auVar239._4_4_ = fVar210 * auVar57._4_4_;
          fVar228 = auVar52._8_4_;
          auVar239._8_4_ = fVar228 * auVar57._8_4_;
          fVar229 = auVar52._12_4_;
          auVar239._12_4_ = fVar229 * auVar57._12_4_;
          auVar58 = vbroadcastss_avx512vl(auVar35);
          auVar51 = vmulps_avx512vl(auVar58,auVar51);
          auVar48 = vmulps_avx512vl(auVar58,auVar48);
          auVar58 = vminps_avx512vl(auVar51,auVar48);
          auVar51 = vmaxps_avx(auVar48,auVar51);
          auVar179._0_4_ = fVar208 * auVar49._0_4_;
          auVar179._4_4_ = fVar208 * auVar49._4_4_;
          auVar179._8_4_ = fVar208 * auVar49._8_4_;
          auVar179._12_4_ = fVar208 * auVar49._12_4_;
          auVar166._0_4_ = fVar208 * auVar56._0_4_;
          auVar166._4_4_ = fVar208 * auVar56._4_4_;
          auVar166._8_4_ = fVar208 * auVar56._8_4_;
          auVar166._12_4_ = fVar208 * auVar56._12_4_;
          auVar48 = vminps_avx(auVar179,auVar166);
          auVar49 = vaddps_avx512vl(auVar58,auVar48);
          auVar56 = vmulps_avx512vl(auVar52,auVar55);
          fVar193 = auVar53._0_4_;
          auVar202._0_4_ = fVar193 * auVar57._0_4_;
          fVar204 = auVar53._4_4_;
          auVar202._4_4_ = fVar204 * auVar57._4_4_;
          fVar205 = auVar53._8_4_;
          auVar202._8_4_ = fVar205 * auVar57._8_4_;
          fVar206 = auVar53._12_4_;
          auVar202._12_4_ = fVar206 * auVar57._12_4_;
          auVar215._0_4_ = fVar193 * auVar55._0_4_;
          auVar215._4_4_ = fVar204 * auVar55._4_4_;
          auVar215._8_4_ = fVar205 * auVar55._8_4_;
          auVar215._12_4_ = fVar206 * auVar55._12_4_;
          auVar48 = vmaxps_avx(auVar166,auVar179);
          auVar167._0_4_ = auVar51._0_4_ + auVar48._0_4_;
          auVar167._4_4_ = auVar51._4_4_ + auVar48._4_4_;
          auVar167._8_4_ = auVar51._8_4_ + auVar48._8_4_;
          auVar167._12_4_ = auVar51._12_4_ + auVar48._12_4_;
          auVar180._8_8_ = 0x3f800000;
          auVar180._0_8_ = 0x3f800000;
          auVar51 = vsubps_avx(auVar180,auVar167);
          auVar48 = vsubps_avx(auVar180,auVar49);
          auVar232._0_4_ = fVar207 * auVar51._0_4_;
          auVar232._4_4_ = fVar210 * auVar51._4_4_;
          auVar232._8_4_ = fVar228 * auVar51._8_4_;
          auVar232._12_4_ = fVar229 * auVar51._12_4_;
          auVar227._0_4_ = fVar207 * auVar48._0_4_;
          auVar227._4_4_ = fVar210 * auVar48._4_4_;
          auVar227._8_4_ = fVar228 * auVar48._8_4_;
          auVar227._12_4_ = fVar229 * auVar48._12_4_;
          auVar168._0_4_ = fVar193 * auVar51._0_4_;
          auVar168._4_4_ = fVar204 * auVar51._4_4_;
          auVar168._8_4_ = fVar205 * auVar51._8_4_;
          auVar168._12_4_ = fVar206 * auVar51._12_4_;
          auVar181._0_4_ = fVar193 * auVar48._0_4_;
          auVar181._4_4_ = fVar204 * auVar48._4_4_;
          auVar181._8_4_ = fVar205 * auVar48._8_4_;
          auVar181._12_4_ = fVar206 * auVar48._12_4_;
          auVar51 = vminps_avx(auVar232,auVar227);
          auVar48 = vminps_avx(auVar168,auVar181);
          auVar49 = vminps_avx(auVar51,auVar48);
          auVar51 = vmaxps_avx(auVar227,auVar232);
          auVar48 = vmaxps_avx(auVar181,auVar168);
          auVar48 = vmaxps_avx(auVar48,auVar51);
          auVar57 = vminps_avx512vl(auVar239,auVar56);
          auVar51 = vminps_avx(auVar202,auVar215);
          auVar51 = vminps_avx(auVar57,auVar51);
          auVar51 = vhaddps_avx(auVar49,auVar51);
          auVar56 = vmaxps_avx512vl(auVar56,auVar239);
          auVar49 = vmaxps_avx(auVar215,auVar202);
          auVar49 = vmaxps_avx(auVar49,auVar56);
          auVar48 = vhaddps_avx(auVar48,auVar49);
          auVar51 = vshufps_avx(auVar51,auVar51,0xe8);
          auVar48 = vshufps_avx(auVar48,auVar48,0xe8);
          auVar169._0_4_ = auVar51._0_4_ + auVar54._0_4_;
          auVar169._4_4_ = auVar51._4_4_ + auVar54._4_4_;
          auVar169._8_4_ = auVar51._8_4_ + auVar54._8_4_;
          auVar169._12_4_ = auVar51._12_4_ + auVar54._12_4_;
          auVar182._0_4_ = auVar48._0_4_ + auVar54._0_4_;
          auVar182._4_4_ = auVar48._4_4_ + auVar54._4_4_;
          auVar182._8_4_ = auVar48._8_4_ + auVar54._8_4_;
          auVar182._12_4_ = auVar48._12_4_ + auVar54._12_4_;
          auVar51 = vmaxps_avx(auVar149,auVar169);
          auVar48 = vminps_avx(auVar182,auVar50);
          uVar29 = vcmpps_avx512vl(auVar48,auVar51,1);
          auVar51 = vinsertps_avx(auVar150,auVar156,0x10);
          auVar243 = ZEXT1664(auVar51);
          auVar48 = ZEXT416(5);
          if ((uVar29 & 3) == 0) {
            vucomiss_avx512f(auVar96._0_16_);
            auVar95._0_16_ = vxorps_avx512vl(auVar48,auVar48);
            auVar95._16_48_ = auVar84._16_48_;
            auVar251 = ZEXT1664(auVar95._0_16_);
            local_610 = auVar39._0_4_;
            fStack_60c = auVar39._4_4_;
            fStack_608 = auVar39._8_4_;
            fStack_604 = auVar39._12_4_;
            if ((uint)uVar24 < 4 && (uVar5 == 0 || lVar28 == 0)) {
              bVar11 = false;
              auVar100 = auVar95;
            }
            else {
              lVar28 = 200;
              auVar100 = auVar95;
              do {
                auVar48 = vsubss_avx512f(auVar46,auVar54);
                fVar205 = auVar48._0_4_;
                fVar193 = fVar205 * fVar205 * fVar205;
                fVar206 = auVar54._0_4_;
                fVar204 = fVar206 * 3.0 * fVar205 * fVar205;
                fVar205 = fVar205 * fVar206 * fVar206 * 3.0;
                auVar147._4_4_ = fVar193;
                auVar147._0_4_ = fVar193;
                auVar147._8_4_ = fVar193;
                auVar147._12_4_ = fVar193;
                auVar138._4_4_ = fVar204;
                auVar138._0_4_ = fVar204;
                auVar138._8_4_ = fVar204;
                auVar138._12_4_ = fVar204;
                auVar108._4_4_ = fVar205;
                auVar108._0_4_ = fVar205;
                auVar108._8_4_ = fVar205;
                auVar108._12_4_ = fVar205;
                fVar206 = fVar206 * fVar206 * fVar206;
                auVar152._0_4_ = local_610 * fVar206;
                auVar152._4_4_ = fStack_60c * fVar206;
                auVar152._8_4_ = fStack_608 * fVar206;
                auVar152._12_4_ = fStack_604 * fVar206;
                auVar48 = vfmadd231ps_fma(auVar152,auVar40,auVar108);
                auVar48 = vfmadd231ps_fma(auVar48,auVar41,auVar138);
                auVar48 = vfmadd231ps_fma(auVar48,auVar44,auVar147);
                auVar109._8_8_ = auVar48._0_8_;
                auVar109._0_8_ = auVar48._0_8_;
                auVar48 = vshufpd_avx(auVar48,auVar48,3);
                auVar50 = vshufps_avx(auVar54,auVar54,0x55);
                auVar48 = vsubps_avx(auVar48,auVar109);
                auVar50 = vfmadd213ps_fma(auVar48,auVar50,auVar109);
                fVar193 = auVar50._0_4_;
                auVar48 = vshufps_avx(auVar50,auVar50,0x55);
                auVar110._0_4_ = auVar35._0_4_ * fVar193 + fVar208 * auVar48._0_4_;
                auVar110._4_4_ = auVar35._4_4_ * fVar193 + auVar37._4_4_ * auVar48._4_4_;
                auVar110._8_4_ = auVar35._8_4_ * fVar193 + auVar37._8_4_ * auVar48._8_4_;
                auVar110._12_4_ = auVar35._12_4_ * fVar193 + auVar37._12_4_ * auVar48._12_4_;
                auVar54 = vsubps_avx(auVar54,auVar110);
                auVar48 = vandps_avx512vl(auVar50,auVar245._0_16_);
                auVar100._0_16_ = vprolq_avx512vl(auVar48,0x20);
                auVar48 = vmaxss_avx(auVar100._0_16_,auVar48);
                bVar33 = auVar48._0_4_ <= fVar98;
                if (auVar48._0_4_ < fVar98) {
                  auVar35 = vucomiss_avx512f(auVar95._0_16_);
                  if (bVar33) {
                    auVar37 = vucomiss_avx512f(auVar35);
                    auVar248 = ZEXT1664(auVar37);
                    if (bVar33) {
                      vmovshdup_avx(auVar35);
                      auVar37 = vucomiss_avx512f(auVar95._0_16_);
                      if (bVar33) {
                        auVar46 = vucomiss_avx512f(auVar37);
                        auVar248 = ZEXT1664(auVar46);
                        if (bVar33) {
                          auVar48 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar53 = vinsertps_avx(auVar48,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar48 = vdpps_avx(auVar53,local_470,0x7f);
                          auVar50 = vdpps_avx(auVar53,local_480,0x7f);
                          auVar49 = vdpps_avx(auVar53,local_490,0x7f);
                          auVar56 = vdpps_avx(auVar53,local_4a0,0x7f);
                          auVar57 = vdpps_avx(auVar53,local_4b0,0x7f);
                          auVar55 = vdpps_avx(auVar53,local_4c0,0x7f);
                          auVar52 = vdpps_avx(auVar53,local_4d0,0x7f);
                          auVar53 = vdpps_avx(auVar53,local_4e0,0x7f);
                          auVar54 = vsubss_avx512f(auVar46,auVar37);
                          fVar208 = auVar37._0_4_;
                          auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * auVar57._0_4_)),auVar54
                                                    ,auVar48);
                          auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar55._0_4_ * fVar208)),auVar54
                                                    ,auVar50);
                          auVar50 = vfmadd231ss_fma(ZEXT416((uint)(auVar52._0_4_ * fVar208)),auVar54
                                                    ,auVar49);
                          auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * auVar53._0_4_)),auVar54
                                                    ,auVar56);
                          auVar100._0_16_ = vsubss_avx512f(auVar46,auVar35);
                          auVar153._0_4_ = auVar100._0_4_;
                          fVar208 = auVar153._0_4_ * auVar153._0_4_ * auVar153._0_4_;
                          fVar205 = auVar35._0_4_;
                          fVar193 = fVar205 * 3.0 * auVar153._0_4_ * auVar153._0_4_;
                          fVar204 = auVar153._0_4_ * fVar205 * fVar205 * 3.0;
                          fVar207 = fVar205 * fVar205 * fVar205;
                          auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar207 * auVar49._0_4_)),
                                                    ZEXT416((uint)fVar204),auVar50);
                          auVar46 = vfmadd231ss_fma(auVar46,ZEXT416((uint)fVar193),auVar48);
                          auVar37 = vfmadd231ss_fma(auVar46,ZEXT416((uint)fVar208),auVar37);
                          fVar206 = auVar37._0_4_;
                          if ((fVar209 <= fVar206) &&
                             (fVar210 = *(float *)(ray + k * 4 + 0x200), fVar206 <= fVar210)) {
                            auVar37 = vshufps_avx(auVar35,auVar35,0x55);
                            auVar48 = vsubps_avx512vl(auVar34,auVar37);
                            fVar228 = auVar37._0_4_;
                            auVar189._0_4_ = fVar228 * (float)local_500._0_4_;
                            fVar229 = auVar37._4_4_;
                            auVar189._4_4_ = fVar229 * (float)local_500._4_4_;
                            fVar230 = auVar37._8_4_;
                            auVar189._8_4_ = fVar230 * fStack_4f8;
                            fVar174 = auVar37._12_4_;
                            auVar189._12_4_ = fVar174 * fStack_4f4;
                            auVar203._0_4_ = fVar228 * (float)local_550._0_4_;
                            auVar203._4_4_ = fVar229 * (float)local_550._4_4_;
                            auVar203._8_4_ = fVar230 * fStack_548;
                            auVar203._12_4_ = fVar174 * fStack_544;
                            auVar216._0_4_ = fVar228 * (float)local_560._0_4_;
                            auVar216._4_4_ = fVar229 * (float)local_560._4_4_;
                            auVar216._8_4_ = fVar230 * fStack_558;
                            auVar216._12_4_ = fVar174 * fStack_554;
                            auVar170._0_4_ = fVar228 * (float)local_520._0_4_;
                            auVar170._4_4_ = fVar229 * (float)local_520._4_4_;
                            auVar170._8_4_ = fVar230 * fStack_518;
                            auVar170._12_4_ = fVar174 * fStack_514;
                            auVar34 = vfmadd231ps_fma(auVar189,auVar48,local_4f0);
                            auVar37 = vfmadd231ps_fma(auVar203,auVar48,local_530);
                            auVar46 = vfmadd231ps_fma(auVar216,auVar48,local_540);
                            auVar48 = vfmadd231ps_fma(auVar170,auVar48,local_510);
                            auVar34 = vsubps_avx(auVar37,auVar34);
                            auVar37 = vsubps_avx(auVar46,auVar37);
                            auVar46 = vsubps_avx(auVar48,auVar46);
                            auVar217._0_4_ = fVar205 * auVar37._0_4_;
                            auVar217._4_4_ = fVar205 * auVar37._4_4_;
                            auVar217._8_4_ = fVar205 * auVar37._8_4_;
                            auVar217._12_4_ = fVar205 * auVar37._12_4_;
                            auVar153._4_4_ = auVar153._0_4_;
                            auVar153._8_4_ = auVar153._0_4_;
                            auVar153._12_4_ = auVar153._0_4_;
                            auVar34 = vfmadd231ps_fma(auVar217,auVar153,auVar34);
                            auVar171._0_4_ = fVar205 * auVar46._0_4_;
                            auVar171._4_4_ = fVar205 * auVar46._4_4_;
                            auVar171._8_4_ = fVar205 * auVar46._8_4_;
                            auVar171._12_4_ = fVar205 * auVar46._12_4_;
                            auVar37 = vfmadd231ps_fma(auVar171,auVar153,auVar37);
                            auVar172._0_4_ = fVar205 * auVar37._0_4_;
                            auVar172._4_4_ = fVar205 * auVar37._4_4_;
                            auVar172._8_4_ = fVar205 * auVar37._8_4_;
                            auVar172._12_4_ = fVar205 * auVar37._12_4_;
                            auVar34 = vfmadd231ps_fma(auVar172,auVar153,auVar34);
                            auVar13._8_4_ = 0x40400000;
                            auVar13._0_8_ = 0x4040000040400000;
                            auVar13._12_4_ = 0x40400000;
                            auVar100._0_16_ = vmulps_avx512vl(auVar34,auVar13);
                            pGVar6 = (context->scene->geometries).items[uVar30].ptr;
                            if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                              bVar33 = false;
                            }
                            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                    (bVar33 = true,
                                    pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar148._0_4_ = fVar207 * (float)local_5a0._0_4_;
                              auVar148._4_4_ = fVar207 * (float)local_5a0._4_4_;
                              auVar148._8_4_ = fVar207 * fStack_598;
                              auVar148._12_4_ = fVar207 * fStack_594;
                              auVar139._4_4_ = fVar204;
                              auVar139._0_4_ = fVar204;
                              auVar139._8_4_ = fVar204;
                              auVar139._12_4_ = fVar204;
                              auVar34 = vfmadd132ps_fma(auVar139,auVar148,local_590);
                              auVar132._4_4_ = fVar193;
                              auVar132._0_4_ = fVar193;
                              auVar132._8_4_ = fVar193;
                              auVar132._12_4_ = fVar193;
                              auVar34 = vfmadd132ps_fma(auVar132,auVar34,local_580);
                              auVar120._4_4_ = fVar208;
                              auVar120._0_4_ = fVar208;
                              auVar120._8_4_ = fVar208;
                              auVar120._12_4_ = fVar208;
                              auVar46 = vfmadd132ps_fma(auVar120,auVar34,local_570);
                              auVar34 = vshufps_avx(auVar46,auVar46,0xc9);
                              auVar37 = vshufps_avx(auVar100._0_16_,auVar100._0_16_,0xc9);
                              auVar121._0_4_ = auVar46._0_4_ * auVar37._0_4_;
                              auVar121._4_4_ = auVar46._4_4_ * auVar37._4_4_;
                              auVar121._8_4_ = auVar46._8_4_ * auVar37._8_4_;
                              auVar121._12_4_ = auVar46._12_4_ * auVar37._12_4_;
                              auVar34 = vfmsub231ps_fma(auVar121,auVar100._0_16_,auVar34);
                              local_200 = vbroadcastss_avx512f(auVar35);
                              auVar100 = vbroadcastss_avx512f(ZEXT416(1));
                              local_1c0 = vpermps_avx512f(auVar100,ZEXT1664(auVar35));
                              auVar100 = vpermps_avx512f(auVar100,ZEXT1664(auVar34));
                              auVar243 = vbroadcastss_avx512f(ZEXT416(2));
                              local_280 = vpermps_avx512f(auVar243,ZEXT1664(auVar34));
                              local_240 = vbroadcastss_avx512f(auVar34);
                              local_2c0[0] = (RTCHitN)auVar100[0];
                              local_2c0[1] = (RTCHitN)auVar100[1];
                              local_2c0[2] = (RTCHitN)auVar100[2];
                              local_2c0[3] = (RTCHitN)auVar100[3];
                              local_2c0[4] = (RTCHitN)auVar100[4];
                              local_2c0[5] = (RTCHitN)auVar100[5];
                              local_2c0[6] = (RTCHitN)auVar100[6];
                              local_2c0[7] = (RTCHitN)auVar100[7];
                              local_2c0[8] = (RTCHitN)auVar100[8];
                              local_2c0[9] = (RTCHitN)auVar100[9];
                              local_2c0[10] = (RTCHitN)auVar100[10];
                              local_2c0[0xb] = (RTCHitN)auVar100[0xb];
                              local_2c0[0xc] = (RTCHitN)auVar100[0xc];
                              local_2c0[0xd] = (RTCHitN)auVar100[0xd];
                              local_2c0[0xe] = (RTCHitN)auVar100[0xe];
                              local_2c0[0xf] = (RTCHitN)auVar100[0xf];
                              local_2c0[0x10] = (RTCHitN)auVar100[0x10];
                              local_2c0[0x11] = (RTCHitN)auVar100[0x11];
                              local_2c0[0x12] = (RTCHitN)auVar100[0x12];
                              local_2c0[0x13] = (RTCHitN)auVar100[0x13];
                              local_2c0[0x14] = (RTCHitN)auVar100[0x14];
                              local_2c0[0x15] = (RTCHitN)auVar100[0x15];
                              local_2c0[0x16] = (RTCHitN)auVar100[0x16];
                              local_2c0[0x17] = (RTCHitN)auVar100[0x17];
                              local_2c0[0x18] = (RTCHitN)auVar100[0x18];
                              local_2c0[0x19] = (RTCHitN)auVar100[0x19];
                              local_2c0[0x1a] = (RTCHitN)auVar100[0x1a];
                              local_2c0[0x1b] = (RTCHitN)auVar100[0x1b];
                              local_2c0[0x1c] = (RTCHitN)auVar100[0x1c];
                              local_2c0[0x1d] = (RTCHitN)auVar100[0x1d];
                              local_2c0[0x1e] = (RTCHitN)auVar100[0x1e];
                              local_2c0[0x1f] = (RTCHitN)auVar100[0x1f];
                              local_2c0[0x20] = (RTCHitN)auVar100[0x20];
                              local_2c0[0x21] = (RTCHitN)auVar100[0x21];
                              local_2c0[0x22] = (RTCHitN)auVar100[0x22];
                              local_2c0[0x23] = (RTCHitN)auVar100[0x23];
                              local_2c0[0x24] = (RTCHitN)auVar100[0x24];
                              local_2c0[0x25] = (RTCHitN)auVar100[0x25];
                              local_2c0[0x26] = (RTCHitN)auVar100[0x26];
                              local_2c0[0x27] = (RTCHitN)auVar100[0x27];
                              local_2c0[0x28] = (RTCHitN)auVar100[0x28];
                              local_2c0[0x29] = (RTCHitN)auVar100[0x29];
                              local_2c0[0x2a] = (RTCHitN)auVar100[0x2a];
                              local_2c0[0x2b] = (RTCHitN)auVar100[0x2b];
                              local_2c0[0x2c] = (RTCHitN)auVar100[0x2c];
                              local_2c0[0x2d] = (RTCHitN)auVar100[0x2d];
                              local_2c0[0x2e] = (RTCHitN)auVar100[0x2e];
                              local_2c0[0x2f] = (RTCHitN)auVar100[0x2f];
                              local_2c0[0x30] = (RTCHitN)auVar100[0x30];
                              local_2c0[0x31] = (RTCHitN)auVar100[0x31];
                              local_2c0[0x32] = (RTCHitN)auVar100[0x32];
                              local_2c0[0x33] = (RTCHitN)auVar100[0x33];
                              local_2c0[0x34] = (RTCHitN)auVar100[0x34];
                              local_2c0[0x35] = (RTCHitN)auVar100[0x35];
                              local_2c0[0x36] = (RTCHitN)auVar100[0x36];
                              local_2c0[0x37] = (RTCHitN)auVar100[0x37];
                              local_2c0[0x38] = (RTCHitN)auVar100[0x38];
                              local_2c0[0x39] = (RTCHitN)auVar100[0x39];
                              local_2c0[0x3a] = (RTCHitN)auVar100[0x3a];
                              local_2c0[0x3b] = (RTCHitN)auVar100[0x3b];
                              local_2c0[0x3c] = (RTCHitN)auVar100[0x3c];
                              local_2c0[0x3d] = (RTCHitN)auVar100[0x3d];
                              local_2c0[0x3e] = (RTCHitN)auVar100[0x3e];
                              local_2c0[0x3f] = (RTCHitN)auVar100[0x3f];
                              local_180 = local_300._0_8_;
                              uStack_178 = local_300._8_8_;
                              uStack_170 = local_300._16_8_;
                              uStack_168 = local_300._24_8_;
                              uStack_160 = local_300._32_8_;
                              uStack_158 = local_300._40_8_;
                              uStack_150 = local_300._48_8_;
                              uStack_148 = local_300._56_8_;
                              auVar100 = vmovdqa64_avx512f(local_340);
                              local_140 = vmovdqa64_avx512f(auVar100);
                              vpcmpeqd_avx2(auVar100._0_32_,auVar100._0_32_);
                              local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                              local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]))
                              ;
                              *(float *)(ray + k * 4 + 0x200) = fVar206;
                              local_440 = local_380;
                              local_5d0.valid = (int *)local_440;
                              local_5d0.geometryUserPtr = pGVar6->userPtr;
                              local_5d0.context = context->user;
                              local_5d0.ray = (RTCRayN *)ray;
                              local_5d0.hit = local_2c0;
                              local_5d0.N = 0x10;
                              if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar6->occlusionFilterN)(&local_5d0);
                                auVar34 = vxorps_avx512vl(auVar95._0_16_,auVar95._0_16_);
                                auVar251 = ZEXT1664(auVar34);
                                auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar249 = ZEXT1664(auVar34);
                                auVar248 = ZEXT464(0x3f800000);
                                auVar65 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar247 = ZEXT3264(auVar65);
                                auVar34 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar246 = ZEXT1664(auVar34);
                                auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar245 = ZEXT1664(auVar34);
                                auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                auVar244 = ZEXT1664(auVar34);
                                auVar34 = vxorps_avx512vl(auVar36,auVar36);
                                auVar252 = ZEXT1664(auVar34);
                              }
                              auVar36 = auVar252._0_16_;
                              auVar34 = auVar251._0_16_;
                              auVar100 = vmovdqa64_avx512f(local_440);
                              uVar10 = vptestmd_avx512f(auVar100,auVar100);
                              if ((short)uVar10 == 0) {
                                bVar33 = false;
                              }
                              else {
                                p_Var7 = context->args->filter;
                                if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var7)(&local_5d0);
                                  auVar34 = vxorps_avx512vl(auVar34,auVar34);
                                  auVar251 = ZEXT1664(auVar34);
                                  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar249 = ZEXT1664(auVar34);
                                  auVar248 = ZEXT464(0x3f800000);
                                  auVar65 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar247 = ZEXT3264(auVar65);
                                  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar246 = ZEXT1664(auVar34);
                                  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar245 = ZEXT1664(auVar34);
                                  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                  auVar244 = ZEXT1664(auVar34);
                                  auVar34 = vxorps_avx512vl(auVar36,auVar36);
                                  auVar252 = ZEXT1664(auVar34);
                                }
                                auVar100 = vmovdqa64_avx512f(local_440);
                                uVar29 = vptestmd_avx512f(auVar100,auVar100);
                                auVar243 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                                bVar33 = (bool)((byte)uVar29 & 1);
                                auVar100._0_4_ =
                                     (uint)bVar33 * auVar243._0_4_ |
                                     (uint)!bVar33 * *(int *)(local_5d0.ray + 0x200);
                                bVar33 = (bool)((byte)(uVar29 >> 1) & 1);
                                auVar100._4_4_ =
                                     (uint)bVar33 * auVar243._4_4_ |
                                     (uint)!bVar33 * *(int *)(local_5d0.ray + 0x204);
                                bVar33 = (bool)((byte)(uVar29 >> 2) & 1);
                                auVar100._8_4_ =
                                     (uint)bVar33 * auVar243._8_4_ |
                                     (uint)!bVar33 * *(int *)(local_5d0.ray + 0x208);
                                bVar33 = (bool)((byte)(uVar29 >> 3) & 1);
                                auVar100._12_4_ =
                                     (uint)bVar33 * auVar243._12_4_ |
                                     (uint)!bVar33 * *(int *)(local_5d0.ray + 0x20c);
                                bVar33 = (bool)((byte)(uVar29 >> 4) & 1);
                                auVar100._16_4_ =
                                     (uint)bVar33 * auVar243._16_4_ |
                                     (uint)!bVar33 * *(int *)(local_5d0.ray + 0x210);
                                bVar33 = (bool)((byte)(uVar29 >> 5) & 1);
                                auVar100._20_4_ =
                                     (uint)bVar33 * auVar243._20_4_ |
                                     (uint)!bVar33 * *(int *)(local_5d0.ray + 0x214);
                                bVar33 = (bool)((byte)(uVar29 >> 6) & 1);
                                auVar100._24_4_ =
                                     (uint)bVar33 * auVar243._24_4_ |
                                     (uint)!bVar33 * *(int *)(local_5d0.ray + 0x218);
                                bVar33 = (bool)((byte)(uVar29 >> 7) & 1);
                                auVar100._28_4_ =
                                     (uint)bVar33 * auVar243._28_4_ |
                                     (uint)!bVar33 * *(int *)(local_5d0.ray + 0x21c);
                                bVar33 = (bool)((byte)(uVar29 >> 8) & 1);
                                auVar100._32_4_ =
                                     (uint)bVar33 * auVar243._32_4_ |
                                     (uint)!bVar33 * *(int *)(local_5d0.ray + 0x220);
                                bVar33 = (bool)((byte)(uVar29 >> 9) & 1);
                                auVar100._36_4_ =
                                     (uint)bVar33 * auVar243._36_4_ |
                                     (uint)!bVar33 * *(int *)(local_5d0.ray + 0x224);
                                bVar33 = (bool)((byte)(uVar29 >> 10) & 1);
                                auVar100._40_4_ =
                                     (uint)bVar33 * auVar243._40_4_ |
                                     (uint)!bVar33 * *(int *)(local_5d0.ray + 0x228);
                                bVar33 = (bool)((byte)(uVar29 >> 0xb) & 1);
                                auVar100._44_4_ =
                                     (uint)bVar33 * auVar243._44_4_ |
                                     (uint)!bVar33 * *(int *)(local_5d0.ray + 0x22c);
                                bVar33 = (bool)((byte)(uVar29 >> 0xc) & 1);
                                auVar100._48_4_ =
                                     (uint)bVar33 * auVar243._48_4_ |
                                     (uint)!bVar33 * *(int *)(local_5d0.ray + 0x230);
                                bVar33 = (bool)((byte)(uVar29 >> 0xd) & 1);
                                auVar100._52_4_ =
                                     (uint)bVar33 * auVar243._52_4_ |
                                     (uint)!bVar33 * *(int *)(local_5d0.ray + 0x234);
                                bVar33 = (bool)((byte)(uVar29 >> 0xe) & 1);
                                auVar100._56_4_ =
                                     (uint)bVar33 * auVar243._56_4_ |
                                     (uint)!bVar33 * *(int *)(local_5d0.ray + 0x238);
                                bVar33 = SUB81(uVar29 >> 0xf,0);
                                auVar100._60_4_ =
                                     (uint)bVar33 * auVar243._60_4_ |
                                     (uint)!bVar33 * *(int *)(local_5d0.ray + 0x23c);
                                *(undefined1 (*) [64])(local_5d0.ray + 0x200) = auVar100;
                                bVar33 = (short)uVar29 != 0;
                              }
                              if (!bVar33) {
                                *(float *)(ray + k * 4 + 0x200) = fVar210;
                              }
                            }
                            auVar243 = ZEXT1664(auVar51);
                            bVar32 = (bool)(bVar32 | bVar33);
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar28 = lVar28 + -1;
              } while (lVar28 != 0);
            }
          }
          else {
            auVar34 = vxorps_avx512vl(ZEXT416(5),auVar48);
            auVar251 = ZEXT1664(auVar34);
            auVar100._16_48_ = auVar84._16_48_;
            auVar100._0_16_ = auVar104;
          }
        }
        else {
          auVar100._16_48_ = auVar84._16_48_;
          auVar100._0_16_ = auVar104;
        }
      }
      auVar82._32_32_ = auVar100._32_32_;
    } while (bVar11);
    auVar34 = vinsertps_avx512f(auVar96._0_16_,auVar47,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }